

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdpp2.c
# Opt level: O2

MPP_RET vdpp2_params_to_reg(vdpp2_params *src_params,vdpp2_api_ctx *ctx)

{
  anon_struct_4_4_effd29bf_for_reg16 aVar1;
  anon_struct_4_3_89b91cde_for_reg2 aVar2;
  anon_struct_4_9_24a09030_for_reg3 aVar3;
  RK_U32 RVar4;
  anon_struct_4_3_30fecd47_for_reg2 aVar5;
  anon_struct_4_14_016c4910_for_reg0 aVar6;
  anon_struct_4_5_ac9e8c85_for_reg162 aVar7;
  anon_struct_4_5_051dd277_for_reg164 aVar8;
  anon_struct_4_5_e9729c4a_for_reg163 aVar9;
  anon_struct_4_5_dbe3e6bc_for_reg165 aVar10;
  anon_struct_4_5_7d0670dc_for_reg166 aVar11;
  anon_struct_4_5_ee4e9261_for_reg167 aVar12;
  anon_struct_4_6_fef62f20_for_reg2 aVar13;
  anon_struct_4_7_566f0ca7_for_reg3 aVar14;
  anon_struct_4_5_5206536f_for_reg4 aVar15;
  anon_struct_4_5_5206cbae_for_reg6 aVar16;
  anon_struct_4_5_520743ed_for_reg8 aVar17;
  anon_struct_4_6_6b67bfe3_for_reg100 aVar18;
  anon_struct_4_8_1448ed05_for_reg102 aVar19;
  anon_struct_4_7_51a04710_for_reg103 aVar20;
  anon_struct_4_7_f4a15204_for_reg104 aVar21;
  anon_struct_4_7_13dfdf50_for_reg105 aVar22;
  anon_struct_4_7_15216c04_for_reg106 aVar23;
  anon_struct_4_7_1521e444_for_reg107 aVar24;
  RK_S32 RVar25;
  anon_struct_4_6_98c00d60_for_reg110 aVar26;
  anon_struct_4_5_4e72b6e0_for_reg112 aVar27;
  anon_struct_4_5_de9b1aa1_for_reg113 aVar28;
  anon_struct_4_5_8d760384_for_reg114 aVar29;
  anon_struct_4_4_9babbec2_for_reg129 aVar30;
  anon_struct_4_5_7a7ec4dc_for_reg130 aVar31;
  anon_struct_4_7_35acda4c_for_reg131 aVar32;
  anon_struct_4_5_713fce19_for_reg134 aVar33;
  anon_struct_4_5_098cd0aa_for_reg135 aVar34;
  anon_struct_4_7_7222c14c_for_reg136 aVar35;
  anon_struct_4_6_1794af64_for_reg141 aVar36;
  anon_struct_4_6_e5dd6b84_for_reg142 aVar37;
  anon_struct_4_4_f8f30d03_for_reg143 aVar38;
  anon_struct_4_6_b61f7fc4_for_reg145 aVar39;
  anon_struct_4_6_e3c66fa4_for_reg146 aVar40;
  anon_struct_4_4_2f9cacc3_for_reg147 aVar41;
  anon_struct_4_6_54aa5024_for_reg149 aVar42;
  anon_struct_4_6_e1af73c4_for_reg150 aVar43;
  anon_struct_4_4_66464c83_for_reg151 aVar44;
  anon_struct_4_6_f3352084_for_reg153 aVar45;
  anon_struct_4_6_df9877e4_for_reg154 aVar46;
  anon_struct_4_4_9cefec43_for_reg155 aVar47;
  anon_struct_4_6_adc393a5_for_reg156 aVar48;
  anon_struct_4_5_5dea9ddc_for_reg157 aVar49;
  anon_struct_4_7_e0b31a4c_for_reg158 aVar50;
  anon_struct_4_4_73edf603_for_reg10 aVar51;
  anon_struct_4_4_73efd703_for_reg11 aVar52;
  int iVar53;
  anon_struct_4_6_05954ecb_for_reg101 aVar54;
  anon_struct_4_3_724851b1_for_reg108 aVar55;
  anon_struct_4_5_7839e156_for_reg140 aVar56;
  anon_struct_4_5_7839e537_for_reg144 aVar57;
  anon_struct_4_5_7839e918_for_reg148 aVar58;
  anon_struct_4_5_7839ecf9_for_reg152 aVar59;
  ushort uVar60;
  float fVar61;
  anon_struct_4_3_f795cdea_for_reg13 aVar62;
  anon_struct_4_3_f795d56a_for_reg14 aVar63;
  anon_struct_4_3_f795d5aa_for_reg15 aVar64;
  anon_struct_4_3_c249374a_for_reg16 aVar65;
  anon_struct_4_3_c24937c5_for_reg17 aVar66;
  anon_struct_4_3_c2493f2a_for_reg18 aVar67;
  anon_struct_4_3_a38c4f29_for_reg19 aVar68;
  anon_struct_4_3_f3bb69ca_for_reg24 aVar69;
  anon_struct_4_3_f3bb714a_for_reg25 aVar70;
  anon_struct_4_3_f3bb718a_for_reg26 aVar71;
  anon_struct_4_3_4b775ba5_for_reg28 aVar72;
  anon_struct_4_3_4b77630a_for_reg29 aVar73;
  anon_struct_4_3_4022a749_for_reg30 aVar74;
  anon_struct_4_3_efe105aa_for_reg35 aVar75;
  anon_struct_4_3_efe10d2a_for_reg36 aVar76;
  anon_struct_4_3_efe10d6a_for_reg37 aVar77;
  anon_struct_4_3_d4a57f85_for_reg39 aVar78;
  anon_struct_4_3_d4a586ea_for_reg40 aVar79;
  anon_struct_4_3_dcb8ff69_for_reg41 aVar80;
  anon_struct_4_3_ec06a18a_for_reg46 aVar81;
  anon_struct_4_3_ec06a90a_for_reg47 aVar82;
  anon_struct_4_3_ec06a94a_for_reg48 aVar83;
  anon_struct_4_3_5dd3a365_for_reg50 aVar84;
  anon_struct_4_3_5dd3aaca_for_reg51 aVar85;
  anon_struct_4_3_794f5789_for_reg52 aVar86;
  anon_struct_4_3_e82c3d6a_for_reg57 aVar87;
  anon_struct_4_3_e82c44ea_for_reg58 aVar88;
  anon_struct_4_3_e82c452a_for_reg59 aVar89;
  anon_struct_4_3_e701c745_for_reg61 aVar90;
  anon_struct_4_3_e701ceaa_for_reg62 aVar91;
  anon_struct_4_3_15e5afa9_for_reg63 aVar92;
  anon_struct_4_3_e451d94a_for_reg68 aVar93;
  anon_struct_4_3_e451e0ca_for_reg69 aVar94;
  anon_struct_4_3_e451e10a_for_reg70 aVar95;
  anon_struct_4_3_702feb25_for_reg72 aVar96;
  anon_struct_4_3_702ff28a_for_reg73 aVar97;
  anon_struct_4_3_b27c07c9_for_reg74 aVar98;
  anon_struct_4_3_f95e0f05_for_reg83 aVar99;
  anon_struct_4_3_f95e166a_for_reg84 aVar100;
  anon_struct_4_3_4f125fe9_for_reg85 aVar101;
  anon_struct_4_3_fedd8709_for_reg160 aVar102;
  anon_struct_4_3_72b66709_for_reg133 aVar103;
  anon_struct_4_3_e077752a_for_reg79 aVar104;
  anon_struct_4_3_e0777caa_for_reg80 aVar105;
  anon_struct_4_3_e0777cea_for_reg81 aVar106;
  undefined1 auVar107 [12];
  undefined1 auVar108 [12];
  undefined1 auVar109 [12];
  undefined1 auVar110 [12];
  undefined1 auVar111 [12];
  undefined1 auVar112 [12];
  undefined1 auVar113 [12];
  undefined1 auVar114 [12];
  undefined1 auVar115 [12];
  undefined1 auVar116 [12];
  ushort uVar117;
  ushort uVar118;
  ushort uVar119;
  RK_U32 RVar120;
  RK_U32 RVar121;
  byte bVar122;
  anon_struct_4_17_f45c7487_for_reg1 aVar123;
  uint uVar124;
  int iVar125;
  int iVar126;
  MPP_RET extraout_EAX;
  long lVar127;
  ushort uVar128;
  uint uVar129;
  uint uVar130;
  uint uVar131;
  anon_struct_4_5_566da832_for_reg16 aVar132;
  int iVar133;
  anon_struct_4_17_f45c7487_for_reg1 aVar134;
  uint uVar135;
  int iVar136;
  int iVar137;
  int iVar138;
  ushort uVar139;
  uint uVar140;
  anon_struct_4_5_4b644edc_for_reg137 aVar141;
  int iVar142;
  int iVar143;
  uint uVar144;
  uint uVar145;
  int iVar146;
  int iVar147;
  int iVar148;
  int iVar149;
  int iVar150;
  uint uVar151;
  int iVar152;
  int iVar153;
  int iVar154;
  int iVar155;
  int iVar156;
  int iVar157;
  uint uVar158;
  int iVar159;
  uint uVar160;
  uint uVar161;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  float fVar166;
  undefined1 auVar167 [16];
  float fVar168;
  double dVar169;
  double dVar170;
  float fVar172;
  undefined1 auVar171 [16];
  float fVar173;
  float fVar174;
  float fVar175;
  undefined1 auVar176 [16];
  float fVar177;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  ulong uVar183;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  float fVar190;
  undefined1 auVar189 [16];
  RK_U8 diff2conf_lut_k [8];
  uint local_298 [8];
  RK_S32 peaking_ctrl_ratio_N12 [7];
  RK_S32 peaking_ctrl_ratio_N01 [7];
  RK_S32 peaking_ctrl_ratio_P23 [7];
  RK_S32 peaking_ctrl_ratio_P12 [7];
  RK_S32 peaking_ctrl_ratio_P01 [7];
  RK_S32 peaking_ctrl_value_P3 [7];
  RK_S32 peaking_ctrl_value_P2 [7];
  RK_S32 peaking_ctrl_value_P1 [7];
  RK_S32 peaking_ctrl_value_N3 [7];
  RK_S32 peaking_ctrl_value_N2 [7];
  RK_S32 peaking_ctrl_value_N1 [7];
  RK_S32 peaking_ctrl_idx_N3 [7];
  RK_S32 peaking_ctrl_idx_P3 [7];
  RK_S32 peaking_ctrl_idx_N2 [7];
  RK_S32 peaking_ctrl_idx_P2 [7];
  RK_S32 peaking_ctrl_idx_N1 [7];
  RK_S32 peaking_ctrl_idx_P1 [7];
  RK_S32 peaking_ctrl_idx_N0 [7];
  
  uVar124 = 0;
  memset(&ctx->reg,0,0x440);
  *(undefined1 *)&(ctx->reg).common.reg0 = 1;
  (ctx->reg).common.reg1 = (anon_struct_4_17_f45c7487_for_reg1)0x3;
  aVar123 = (anon_struct_4_17_f45c7487_for_reg1)((src_params->src_yuv_swap & 3) << 4 | 3);
  (ctx->reg).common.reg1 = aVar123;
  aVar134 = (anon_struct_4_17_f45c7487_for_reg1)0x13;
  if (src_params->src_fmt != 5) {
    aVar134 = aVar123;
  }
  (ctx->reg).common.reg1 = aVar134;
  aVar134 = (anon_struct_4_17_f45c7487_for_reg1)((src_params->dst_fmt & 3) << 8 | (uint)aVar134);
  (ctx->reg).common.reg1 = aVar134;
  aVar134 = (anon_struct_4_17_f45c7487_for_reg1)
            ((src_params->dst_yuv_swap & 3) << 0xc | (uint)aVar134);
  (ctx->reg).common.reg1 = aVar134;
  uVar129 = 0;
  if (src_params->working_mode != 3) {
    uVar129 = *(int *)&src_params->dmsr_params << 0x18;
  }
  (ctx->reg).common.reg1 = (anon_struct_4_17_f45c7487_for_reg1)(uVar129 | (uint)aVar134);
  *(byte *)&(ctx->reg).common.reg2 = (byte)src_params->working_mode & 3;
  if (((byte)vdpp2_debug & 1) == 0) {
    uVar128 = 0xfff;
    bVar122 = 0x73;
    uVar129 = 0;
    uVar145 = 0;
  }
  else {
    _mpp_log_l(4,"vdpp2","working_mode %d",(char *)0x0,(ulong)src_params->working_mode);
    uVar145 = (uint)*(ushort *)&(ctx->reg).common.reg13.field_0x2 << 0x10;
    uVar128 = SUB42((ctx->reg).common.reg4,0) | 0xfff;
    bVar122 = *(byte *)&(ctx->reg).common.reg8 | 0x73;
    uVar129 = (uint)(ctx->reg).common.reg14 & 0xffff0800;
    uVar124 = (uint)(ctx->reg).common.reg15 & 0xffff0800;
  }
  *(ushort *)&(ctx->reg).common.reg4 = uVar128;
  *(byte *)&(ctx->reg).common.reg8 = bVar122;
  uVar130 = src_params->src_width & 0xf;
  uVar144 = 0x10 - uVar130;
  if (uVar130 == 0) {
    uVar144 = 0;
  }
  uVar140 = src_params->src_height & 7;
  uVar130 = 8 - uVar140;
  if (uVar140 == 0) {
    uVar130 = 0;
  }
  uVar131 = src_params->dst_width & 0xf;
  uVar140 = 0x10 - uVar131;
  if (uVar131 == 0) {
    uVar140 = 0;
  }
  *(short *)&(ctx->reg).common.reg12 = (short)(src_params->src_width_vir >> 2);
  uVar131 = src_params->dst_width_vir >> 2 & 0xffff;
  (ctx->reg).common.reg13 = (anon_struct_4_2_b89f876b_for_reg13)(uVar145 | uVar131);
  uVar145 = (uVar144 & 0xf) << 0xc | (uVar144 + src_params->src_width) - 1 & 0x7ff;
  (ctx->reg).common.reg14 = (anon_struct_4_6_2c2caa47_for_reg14)(uVar145 | uVar129);
  (ctx->reg).common.reg14 =
       (anon_struct_4_6_2c2caa47_for_reg14)
       ((uVar130 & 7) << 0x1c | uVar145 | uVar129 & 0x8800ffff |
       (src_params->src_height + uVar130) * 0x10000 + 0x7ff0000 & 0x7ff0000);
  uVar129 = (uVar140 & 0xf) << 0xc | (src_params->dst_width + uVar140) - 1 & 0x7ff;
  (ctx->reg).common.reg15 = (anon_struct_4_4_4045accf_for_reg15)(uVar129 | uVar124);
  (ctx->reg).common.reg15 =
       (anon_struct_4_4_4045accf_for_reg15)
       (uVar129 | uVar124 & 0xf800ffff | src_params->dst_height * 0x10000 + 0x7ff0000 & 0x7ff0000);
  (ctx->reg).common.reg20 = (anon_struct_4_2_3349d787_for_reg20)0x88ffffff;
  (ctx->reg).common.reg24 = (anon_struct_4_1_9b21a0fa_for_reg24)(src_params->src).y;
  (ctx->reg).common.reg25 = (anon_struct_4_1_c9127a9e_for_reg25)(src_params->src).cbcr;
  (ctx->reg).common.reg26 = (anon_struct_4_1_c50c69f9_for_reg26)(src_params->dst).y;
  (ctx->reg).common.reg27 = (anon_struct_4_1_dc80d17f_for_reg27)(src_params->dst).cbcr;
  if (src_params->yuv_out_diff != 0) {
    uVar129 = src_params->dst_c_width & 0xf;
    uVar124 = 0x10 - uVar129;
    if (uVar129 == 0) {
      uVar124 = 0;
    }
    (ctx->reg).common.reg1 =
         (anon_struct_4_17_f45c7487_for_reg1)
         ((uint)(ctx->reg).common.reg1 & 0xfffffbff | (src_params->yuv_out_diff & 1) << 10);
    (ctx->reg).common.reg13 =
         (anon_struct_4_2_b89f876b_for_reg13)
         ((src_params->dst_c_width_vir & 0xfffffffc) << 0xe | uVar131);
    aVar1 = (ctx->reg).common.reg16;
    uVar124 = (uVar124 & 0xf) << 0xc | (src_params->dst_c_width + uVar124) - 1 & 0x7ff;
    (ctx->reg).common.reg16 =
         (anon_struct_4_4_effd29bf_for_reg16)(uVar124 | (uint)aVar1 & 0xffff0800);
    (ctx->reg).common.reg16 =
         (anon_struct_4_4_effd29bf_for_reg16)
         (uVar124 | (uint)aVar1 & 0xf8000800 |
         src_params->dst_c_height * 0x10000 + 0x7ff0000 & 0x7ff0000);
    (ctx->reg).common.reg27 = (anon_struct_4_1_dc80d17f_for_reg27)(src_params->dst_c).cbcr;
  }
  set_dmsr_to_vdpp_reg(&src_params->dmsr_params,&ctx->dmsr);
  update_dci_ctl(src_params);
  switch(src_params->dci_format) {
  case 0:
    uVar129 = src_params->src_width_vir;
    uVar124 = uVar129 * 3;
    goto LAB_0013beb9;
  case 1:
    uVar124 = src_params->src_width_vir;
    uVar183 = (ulong)uVar124;
    break;
  default:
    _mpp_log_l(2,"vdpp2","warning: unsupported dci format %d",(char *)0x0);
    goto LAB_0013c182;
  case 4:
    uVar124 = src_params->src_width_vir;
    uVar129 = uVar124;
LAB_0013beb9:
    uVar183 = (ulong)uVar129;
    uVar124 = uVar124 >> 2;
    break;
  case 5:
    uVar183 = (ulong)src_params->src_width_vir;
    uVar124 = src_params->src_width_vir * 10 >> 5;
  }
  uVar129 = src_params->dci_vsd_mode;
  if ((src_params->dci_hsd_mode & 1) == 0) {
    iVar147 = 0;
    if (0x780 < (uint)uVar183) {
      if (((byte)vdpp2_debug & 2) != 0) {
        _mpp_log_l(4,"vdpp2","w_vir %d hsd mode %d is optimized as mode 1\n",(char *)0x0,uVar183,0);
      }
      goto LAB_0013bf15;
    }
  }
  else {
LAB_0013bf15:
    iVar147 = 1;
  }
  uVar145 = uVar129 & 3;
  if (((uVar129 & 1) == 0) && (0x438 < src_params->src_height_vir)) {
    if (((byte)vdpp2_debug & 2) != 0) {
      _mpp_log_l(4,"vdpp2","h_vir %d vsd mode %d is optimized as mode 1\n",(char *)0x0);
    }
    uVar145 = 1;
LAB_0013bf64:
    if (0x870 < src_params->src_height_vir) {
      if (((byte)vdpp2_debug & 2) != 0) {
        _mpp_log_l(4,"vdpp2","h_vir %d vsd mode %d is optimized as mode 2\n",(char *)0x0);
      }
      uVar145 = 2;
    }
  }
  else if (uVar145 < 2) goto LAB_0013bf64;
  uVar129 = src_params->src_height;
  if (src_params->working_mode == 2) {
    uVar145 = 0;
    iVar147 = 0;
  }
  iVar126 = (uVar145 == 1) + 1;
  if (uVar145 == 2) {
    iVar126 = 4;
  }
  if (uVar129 < 0x438) {
    uVar129 = (uVar129 & 0xffff) / (uint)(iVar126 << 4);
  }
  else {
    bVar122 = 6;
    if (uVar145 != 2) {
      bVar122 = uVar145 == 1 | 4;
    }
    uVar129 = (uVar129 - 1) + iVar126 * 0x10 >> bVar122;
  }
  uVar144 = src_params->src_width;
  uVar130 = (iVar147 * 2 + 2) * 0x10;
  if (uVar144 < 0x438) {
    uVar130 = (uVar144 & 0xffff) / uVar130;
  }
  else {
    uVar130 = (uVar144 + uVar130) - 1 >> (byte)iVar147 + 5;
  }
  (ctx->reg).common.reg1 =
       (anon_struct_4_17_f45c7487_for_reg1)
       ((uint)(ctx->reg).common.reg1 & 0xfdffffff | (src_params->hist_cnt_en & 1) << 0x19);
  (ctx->reg).dci.reg0 = (anon_struct_4_1_3a028d4a_for_reg0)(src_params->src).y;
  uVar144 = (uint)*(ushort *)&(ctx->reg).dci.reg1.field_0x2 << 0x10;
  uVar124 = uVar124 & 0xffff;
  (ctx->reg).dci.reg1 = (anon_struct_4_3_07565349_for_reg1)(uVar124 | uVar144);
  uVar140 = (src_params->dci_yrgb_gather_num & 0xf) << 0x10;
  (ctx->reg).dci.reg1 =
       (anon_struct_4_3_07565349_for_reg1)(uVar124 | uVar144 & 0xfff0ffff | uVar140);
  (ctx->reg).dci.reg1 =
       (anon_struct_4_3_07565349_for_reg1)
       (uVar124 | uVar144 & 0xffe0ffff | uVar140 | (src_params->dci_yrgb_gather_en & 1) << 0x14);
  uVar124 = (((uint)(byte)~(byte)iVar147 * 2 | 0xffc) & src_params->src_width) - 1 & 0xfff;
  aVar2 = (ctx->reg).dci.reg2;
  (ctx->reg).dci.reg2 = (anon_struct_4_3_89b91cde_for_reg2)((uint)aVar2 & 0xfffff000 | uVar124);
  (ctx->reg).dci.reg2 =
       (anon_struct_4_3_89b91cde_for_reg2)
       ((uint)aVar2 & 0xf000f000 | uVar124 |
       (-iVar126 & src_params->src_height) * 0x10000 + 0xfff0000 & 0xfff0000);
  aVar3 = (ctx->reg).dci.reg3;
  uVar124 = src_params->dci_format & 7;
  (ctx->reg).dci.reg3 = (anon_struct_4_9_24a09030_for_reg3)((uint)aVar3 & 0xfffffff8 | uVar124);
  uVar124 = (uVar145 << 4 | (uint)aVar3 & 0xffffff80 | uVar124) +
            (src_params->dci_csc_range & 1U) * 8;
  uVar144 = iVar147 << 6;
  (ctx->reg).dci.reg3 = (anon_struct_4_9_24a09030_for_reg3)(uVar144 | uVar124);
  uVar145 = (src_params->dci_alpha_swap & 1U) << 7;
  (ctx->reg).dci.reg3 =
       (anon_struct_4_9_24a09030_for_reg3)(uVar144 | uVar124 & 0xffffff7f | uVar145);
  (ctx->reg).dci.reg3 =
       (anon_struct_4_9_24a09030_for_reg3)
       ((uVar130 & 0xff) << 0x10 | uVar129 << 0x18 | (src_params->dci_rbuv_swap & 1U) << 8 |
       uVar144 | uVar124 & 0xfe7f | uVar145);
  (ctx->reg).dci.reg4 = (anon_struct_4_1_540e9c9c_for_reg4)src_params->hist;
LAB_0013c182:
  diff2conf_lut_k[0] = '\0';
  diff2conf_lut_k[1] = '\0';
  diff2conf_lut_k[2] = '\0';
  diff2conf_lut_k[3] = '\0';
  diff2conf_lut_k[4] = '\0';
  diff2conf_lut_k[5] = '\0';
  diff2conf_lut_k[6] = '\0';
  diff2conf_lut_k[7] = '\0';
  uVar124 = (src_params->es_params).es_iWgtGain;
  uVar129 = (src_params->es_params).es_iWgtLocalTh;
  update_es_tan(&src_params->es_params);
  *(byte *)&(ctx->reg).es.reg0 =
       *(byte *)&(ctx->reg).es.reg0 & 0xfe | (byte)(src_params->es_params).es_bEnabledES & 1;
  RVar4 = (src_params->es_params).es_iGradNoDirTh;
  (ctx->reg).es.reg1.field_0x1 = (char)RVar4;
  *(ushort *)&(ctx->reg).es.reg1 =
       (ushort)(byte)(src_params->es_params).es_iGradFlatTh | (ushort)(RVar4 << 8);
  uVar145 = ((src_params->es_params).es_tan_lo_th & 0x1ff) << 0x10;
  aVar5 = (ctx->reg).es.reg2;
  (ctx->reg).es.reg2 = (anon_struct_4_3_30fecd47_for_reg2)((uint)aVar5 & 0xfe00ffff | uVar145);
  (ctx->reg).es.reg2 =
       (anon_struct_4_3_30fecd47_for_reg2)
       ((uint)aVar5 & 0xfe00fe00 | uVar145 | (src_params->es_params).es_tan_hi_th & 0x1ff);
  *(ushort *)&(ctx->reg).es.reg3 =
       SUB42((ctx->reg).es.reg3,0) & 0xfffe |
       (ushort)(src_params->es_params).es_bEndpointCheckEnable & 1;
  uVar145 = (src_params->es_params).es_iK1;
  *(short *)&(ctx->reg).es.reg4 = (short)uVar145;
  (ctx->reg).es.reg4 =
       (anon_struct_4_2_34aad9ab_for_reg4)
       ((src_params->es_params).es_iDeltaLimit << 0x10 | uVar145 & 0xffff);
  RVar4 = (src_params->es_params).es_iK2;
  *(short *)&(ctx->reg).es.reg5.field_0x2 = (short)RVar4;
  (ctx->reg).es.reg5 =
       (anon_struct_4_2_9ad3edb5_for_reg5)
       ((uint)(ushort)(src_params->es_params).es_iDiff2conf_lut_x[0] | RVar4 << 0x10);
  RVar4 = (src_params->es_params).es_iDiff2conf_lut_x[1];
  *(short *)&(ctx->reg).es.reg6.field_0x2 = (short)RVar4;
  (ctx->reg).es.reg6 =
       (anon_struct_4_2_02c81542_for_reg6)
       ((uint)(ushort)(src_params->es_params).es_iDiff2conf_lut_x[2] | RVar4 << 0x10);
  RVar4 = (src_params->es_params).es_iDiff2conf_lut_x[3];
  *(short *)&(ctx->reg).es.reg7.field_0x2 = (short)RVar4;
  (ctx->reg).es.reg7 =
       (anon_struct_4_2_02c81582_for_reg7)
       ((uint)(ushort)(src_params->es_params).es_iDiff2conf_lut_x[4] | RVar4 << 0x10);
  RVar4 = (src_params->es_params).es_iDiff2conf_lut_x[5];
  *(short *)&(ctx->reg).es.reg8.field_0x2 = (short)RVar4;
  (ctx->reg).es.reg8 =
       (anon_struct_4_2_02c815c2_for_reg8)
       ((uint)(ushort)(src_params->es_params).es_iDiff2conf_lut_x[6] | RVar4 << 0x10);
  RVar4 = (src_params->es_params).es_iDiff2conf_lut_x[7];
  *(short *)&(ctx->reg).es.reg9.field_0x2 = (short)RVar4;
  (ctx->reg).es.reg9 =
       (anon_struct_4_2_02c81602_for_reg9)
       ((uint)(ushort)(src_params->es_params).es_iDiff2conf_lut_x[8] | RVar4 << 0x10);
  bVar122 = (byte)(src_params->es_params).es_iDiff2conf_lut_y[0];
  aVar51._1_3_ = SUB43((ctx->reg).es.reg10,1);
  aVar51._0_1_ = bVar122;
  (ctx->reg).es.reg10 = aVar51;
  uVar145 = ((src_params->es_params).es_iDiff2conf_lut_y[1] & 0xff) << 8;
  (ctx->reg).es.reg10 = (anon_struct_4_4_73edf603_for_reg10)((uint)aVar51 & 0xffff00ff | uVar145);
  uVar144 = ((src_params->es_params).es_iDiff2conf_lut_y[2] & 0xff) << 0x10;
  (ctx->reg).es.reg10 =
       (anon_struct_4_4_73edf603_for_reg10)((uint)aVar51 & 0xff0000ff | uVar145 | uVar144);
  (ctx->reg).es.reg10 =
       (anon_struct_4_4_73edf603_for_reg10)
       (bVar122 | uVar145 | uVar144 | (src_params->es_params).es_iDiff2conf_lut_y[3] << 0x18);
  bVar122 = (byte)(src_params->es_params).es_iDiff2conf_lut_y[4];
  aVar52._1_3_ = SUB43((ctx->reg).es.reg11,1);
  aVar52._0_1_ = bVar122;
  (ctx->reg).es.reg11 = aVar52;
  uVar144 = ((src_params->es_params).es_iDiff2conf_lut_y[5] & 0xff) << 8;
  (ctx->reg).es.reg11 = (anon_struct_4_4_73efd703_for_reg11)((uint)aVar52 & 0xffff00ff | uVar144);
  uVar145 = ((src_params->es_params).es_iDiff2conf_lut_y[6] & 0xff) << 0x10;
  (ctx->reg).es.reg11 =
       (anon_struct_4_4_73efd703_for_reg11)((uint)aVar52 & 0xff0000ff | uVar144 | uVar145);
  (ctx->reg).es.reg11 =
       (anon_struct_4_4_73efd703_for_reg11)
       (bVar122 | uVar144 | uVar145 | (src_params->es_params).es_iDiff2conf_lut_y[7] << 0x18);
  *(char *)&(ctx->reg).es.reg12 = (char)(src_params->es_params).es_iDiff2conf_lut_y[8];
  for (lVar127 = 0; lVar127 != 8; lVar127 = lVar127 + 1) {
    dVar169 = (((double)(src_params->es_params).es_iDiff2conf_lut_y[lVar127 + 1] -
               (double)(src_params->es_params).es_iDiff2conf_lut_y[lVar127]) * 256.0) /
              ((double)(src_params->es_params).es_iDiff2conf_lut_x[lVar127 + 1] -
              (double)(src_params->es_params).es_iDiff2conf_lut_x[lVar127]);
    dVar170 = dVar169 + -1.0;
    if ((double)(int)dVar169 <= dVar169) {
      dVar170 = dVar169;
    }
    iVar147 = (int)dVar170;
    if (0xfe < iVar147) {
      iVar147 = 0xff;
    }
    if (iVar147 < 1) {
      iVar147 = 0;
    }
    diff2conf_lut_k[lVar127] = (RK_U8)iVar147;
  }
  uVar124 = (uint)(((float)uVar129 * 256.0) / (float)uVar124);
  if (0xfe < (int)uVar124) {
    uVar124 = 0xff;
  }
  uVar129 = 0;
  if (0 < (int)uVar124) {
    uVar129 = uVar124;
  }
  (ctx->reg).es.reg13 = (anon_struct_4_4_73221983_for_reg13)diff2conf_lut_k._0_4_;
  (ctx->reg).es.reg14 = (anon_struct_4_4_7323fa83_for_reg14)diff2conf_lut_k._4_4_;
  RVar4 = (src_params->es_params).es_iWgtDecay;
  *(char *)&(ctx->reg).es.reg15 = (char)RVar4;
  *(ushort *)&(ctx->reg).es.reg15 =
       (ushort)((src_params->es_params).es_iWgtGain << 8) | (ushort)RVar4 & 0xff;
  aVar132 = (anon_struct_4_5_566da832_for_reg16)((uint)(ctx->reg).es.reg16 & 0xffffff00 | uVar129);
  (ctx->reg).es.reg16 = aVar132;
  uVar124 = ((src_params->es_params).es_iConfCntTh & 0xf) << 8;
  (ctx->reg).es.reg16 = (anon_struct_4_5_566da832_for_reg16)((uint)aVar132 & 0xfffff0ff | uVar124);
  uVar129 = (src_params->es_params).es_iLowConfTh << 0x18;
  (ctx->reg).es.reg16 =
       (anon_struct_4_5_566da832_for_reg16)((uint)aVar132 & 0xfff0ff | uVar124 | uVar129);
  (ctx->reg).es.reg16 =
       (anon_struct_4_5_566da832_for_reg16)
       ((uint)aVar132 & 0xf0ff | uVar124 | uVar129 |
       ((src_params->es_params).es_iLowConfRatio & 0xff) << 0x10);
  diff2conf_lut_k[0] = '\0';
  diff2conf_lut_k[1] = '\0';
  diff2conf_lut_k[2] = '\0';
  diff2conf_lut_k[3] = '\0';
  diff2conf_lut_k[4] = '\0';
  diff2conf_lut_k[5] = '\0';
  diff2conf_lut_k[6] = '\0';
  diff2conf_lut_k[7] = '\0';
  peaking_ctrl_idx_N0[4] = 0;
  peaking_ctrl_idx_N0[5] = 0;
  peaking_ctrl_idx_N0[6] = 0;
  peaking_ctrl_idx_N0[0] = 0;
  peaking_ctrl_idx_N0[1] = 0;
  peaking_ctrl_idx_N0[2] = 0;
  peaking_ctrl_idx_N0[3] = 0;
  peaking_ctrl_idx_P1[4] = 0;
  peaking_ctrl_idx_P1[5] = 0;
  peaking_ctrl_idx_P1[6] = 0;
  peaking_ctrl_idx_P1[0] = 0;
  peaking_ctrl_idx_P1[1] = 0;
  peaking_ctrl_idx_P1[2] = 0;
  peaking_ctrl_idx_P1[3] = 0;
  peaking_ctrl_idx_N1[4] = 0;
  peaking_ctrl_idx_N1[5] = 0;
  peaking_ctrl_idx_N1[6] = 0;
  peaking_ctrl_idx_N1[0] = 0;
  peaking_ctrl_idx_N1[1] = 0;
  peaking_ctrl_idx_N1[2] = 0;
  peaking_ctrl_idx_N1[3] = 0;
  peaking_ctrl_idx_P2[4] = 0;
  peaking_ctrl_idx_P2[5] = 0;
  peaking_ctrl_idx_P2[6] = 0;
  peaking_ctrl_idx_P2[0] = 0;
  peaking_ctrl_idx_P2[1] = 0;
  peaking_ctrl_idx_P2[2] = 0;
  peaking_ctrl_idx_P2[3] = 0;
  peaking_ctrl_idx_N2[4] = 0;
  peaking_ctrl_idx_N2[5] = 0;
  peaking_ctrl_idx_N2[6] = 0;
  peaking_ctrl_idx_N2[0] = 0;
  peaking_ctrl_idx_N2[1] = 0;
  peaking_ctrl_idx_N2[2] = 0;
  peaking_ctrl_idx_N2[3] = 0;
  peaking_ctrl_idx_P3[4] = 0;
  peaking_ctrl_idx_P3[5] = 0;
  peaking_ctrl_idx_P3[6] = 0;
  peaking_ctrl_idx_P3[0] = 0;
  peaking_ctrl_idx_P3[1] = 0;
  peaking_ctrl_idx_P3[2] = 0;
  peaking_ctrl_idx_P3[3] = 0;
  peaking_ctrl_idx_N3[4] = 0;
  peaking_ctrl_idx_N3[5] = 0;
  peaking_ctrl_idx_N3[6] = 0;
  peaking_ctrl_idx_N3[0] = 0;
  peaking_ctrl_idx_N3[1] = 0;
  peaking_ctrl_idx_N3[2] = 0;
  peaking_ctrl_idx_N3[3] = 0;
  peaking_ctrl_value_N1[4] = 0;
  peaking_ctrl_value_N1[5] = 0;
  peaking_ctrl_value_N1[6] = 0;
  peaking_ctrl_value_N1[0] = 0;
  peaking_ctrl_value_N1[1] = 0;
  peaking_ctrl_value_N1[2] = 0;
  peaking_ctrl_value_N1[3] = 0;
  peaking_ctrl_value_N2[4] = 0;
  peaking_ctrl_value_N2[5] = 0;
  peaking_ctrl_value_N2[6] = 0;
  peaking_ctrl_value_N2[0] = 0;
  peaking_ctrl_value_N2[1] = 0;
  peaking_ctrl_value_N2[2] = 0;
  peaking_ctrl_value_N2[3] = 0;
  peaking_ctrl_value_N3[4] = 0;
  peaking_ctrl_value_N3[5] = 0;
  peaking_ctrl_value_N3[6] = 0;
  peaking_ctrl_value_N3[0] = 0;
  peaking_ctrl_value_N3[1] = 0;
  peaking_ctrl_value_N3[2] = 0;
  peaking_ctrl_value_N3[3] = 0;
  peaking_ctrl_value_P1[4] = 0;
  peaking_ctrl_value_P1[5] = 0;
  peaking_ctrl_value_P1[6] = 0;
  peaking_ctrl_value_P1[0] = 0;
  peaking_ctrl_value_P1[1] = 0;
  peaking_ctrl_value_P1[2] = 0;
  peaking_ctrl_value_P1[3] = 0;
  peaking_ctrl_value_P2[4] = 0;
  peaking_ctrl_value_P2[5] = 0;
  peaking_ctrl_value_P2[6] = 0;
  peaking_ctrl_value_P2[0] = 0;
  peaking_ctrl_value_P2[1] = 0;
  peaking_ctrl_value_P2[2] = 0;
  peaking_ctrl_value_P2[3] = 0;
  peaking_ctrl_value_P3[4] = 0;
  peaking_ctrl_value_P3[5] = 0;
  peaking_ctrl_value_P3[6] = 0;
  peaking_ctrl_value_P3[0] = 0;
  peaking_ctrl_value_P3[1] = 0;
  peaking_ctrl_value_P3[2] = 0;
  peaking_ctrl_value_P3[3] = 0;
  peaking_ctrl_ratio_P01[4] = 0;
  peaking_ctrl_ratio_P01[5] = 0;
  peaking_ctrl_ratio_P01[6] = 0;
  peaking_ctrl_ratio_P01[0] = 0;
  peaking_ctrl_ratio_P01[1] = 0;
  peaking_ctrl_ratio_P01[2] = 0;
  peaking_ctrl_ratio_P01[3] = 0;
  peaking_ctrl_ratio_P12[4] = 0;
  peaking_ctrl_ratio_P12[5] = 0;
  peaking_ctrl_ratio_P12[6] = 0;
  peaking_ctrl_ratio_P12[0] = 0;
  peaking_ctrl_ratio_P12[1] = 0;
  peaking_ctrl_ratio_P12[2] = 0;
  peaking_ctrl_ratio_P12[3] = 0;
  peaking_ctrl_ratio_P23[4] = 0;
  peaking_ctrl_ratio_P23[5] = 0;
  peaking_ctrl_ratio_P23[6] = 0;
  peaking_ctrl_ratio_P23[0] = 0;
  peaking_ctrl_ratio_P23[1] = 0;
  peaking_ctrl_ratio_P23[2] = 0;
  peaking_ctrl_ratio_P23[3] = 0;
  peaking_ctrl_ratio_N01[4] = 0;
  peaking_ctrl_ratio_N01[5] = 0;
  peaking_ctrl_ratio_N01[6] = 0;
  peaking_ctrl_ratio_N01[0] = 0;
  peaking_ctrl_ratio_N01[1] = 0;
  peaking_ctrl_ratio_N01[2] = 0;
  peaking_ctrl_ratio_N01[3] = 0;
  peaking_ctrl_ratio_N12[4] = 0;
  peaking_ctrl_ratio_N12[5] = 0;
  peaking_ctrl_ratio_N12[6] = 0;
  peaking_ctrl_ratio_N12[0] = 0;
  peaking_ctrl_ratio_N12[1] = 0;
  peaking_ctrl_ratio_N12[2] = 0;
  peaking_ctrl_ratio_N12[3] = 0;
  local_298[4] = 0;
  local_298[5] = 0;
  local_298[6] = 0;
  local_298[0] = 0;
  local_298[1] = 0;
  local_298[2] = 0;
  local_298[3] = 0;
  aVar6 = (ctx->reg).sharp.reg0;
  uVar129 = (ushort)(src_params->shp_params).sharp_enable & 1;
  uVar139 = aVar6._0_2_;
  uVar128 = (ushort)uVar129;
  *(ushort *)&(ctx->reg).sharp.reg0 = uVar139 & 0xfffe | uVar128;
  uVar124 = 2;
  if ((src_params->shp_params).lti_h_enable == 0) {
    uVar124 = (uint)((src_params->shp_params).lti_v_enable != 0) * 2;
  }
  *(ushort *)&(ctx->reg).sharp.reg0 = (ushort)uVar124 | uVar139 & 0xfffc | uVar128;
  uVar129 = (uVar124 | (uint)aVar6 & 0xfffffff8 | uVar129) +
            ((src_params->shp_params).cti_h_enable & 1U) * 4;
  *(short *)&(ctx->reg).sharp.reg0 = (short)uVar129;
  uVar145 = (uVar129 & 0xfffffff7) + ((src_params->shp_params).peaking_enable & 1U) * 8;
  uVar128 = (ushort)uVar145;
  *(ushort *)&(ctx->reg).sharp.reg0 = uVar128;
  uVar129 = 0x10;
  if (((src_params->shp_params).peaking_coring_enable == 0) &&
     ((src_params->shp_params).peaking_gain_enable == 0)) {
    uVar129 = (uint)((src_params->shp_params).peaking_limit_ctrl_enable != 0) << 4;
  }
  uVar117 = (ushort)uVar129;
  *(ushort *)&(ctx->reg).sharp.reg0 = uVar117 | uVar128 & 0xffef;
  uVar144 = ((src_params->shp_params).peaking_edge_ctrl_enable & 1U) << 6;
  uVar139 = (ushort)uVar144;
  *(ushort *)&(ctx->reg).sharp.reg0 = uVar117 | uVar128 & 0xffaf | uVar139;
  uVar130 = ((src_params->shp_params).shootctrl_enable & 1U) << 7;
  uVar60 = (ushort)uVar130;
  *(ushort *)&(ctx->reg).sharp.reg0 = uVar117 | uVar128 & 0xff2f | uVar139 | uVar60;
  uVar140 = ((src_params->shp_params).global_gain_enable & 1U) << 8;
  uVar118 = (ushort)uVar140;
  *(ushort *)&(ctx->reg).sharp.reg0 = uVar117 | uVar128 & 0xfe2f | uVar139 | uVar60 | uVar118;
  uVar131 = ((src_params->shp_params).color_ctrl_enable & 1U) << 9;
  uVar119 = (ushort)uVar131;
  *(ushort *)&(ctx->reg).sharp.reg0 =
       uVar117 | uVar128 & 0xfc2f | uVar139 | uVar60 | uVar118 | uVar119;
  uVar135 = ((src_params->shp_params).tex_adj_enable & 1U) << 10;
  *(ushort *)&(ctx->reg).sharp.reg0 =
       uVar117 | uVar128 & 0xf82f | uVar139 | uVar60 | uVar118 | uVar119 | (ushort)uVar135;
  uVar129 = uVar129 | uVar145 & 0xffffc02f | uVar144 | uVar130 | uVar140 | uVar131 | uVar135 |
            ((src_params->shp_params).sharp_coloradj_bypass_en & 1U) << 0xb;
  *(short *)&(ctx->reg).sharp.reg0 = (short)uVar129;
  if (((ushort)uVar124 != 0) && ((src_params->shp_params).lti_h_enable == 0)) {
    (src_params->shp_params).lti_h_gain = 0;
    uVar129 = (uint)*(ushort *)&(ctx->reg).sharp.reg0;
  }
  if (((uVar129 & 2) != 0) && ((src_params->shp_params).lti_v_enable == 0)) {
    (src_params->shp_params).lti_v_gain = 0;
  }
  uVar124 = (src_params->shp_params).lti_h_radius & 1;
  aVar7 = (ctx->reg).sharp.reg162;
  aVar8 = (ctx->reg).sharp.reg164;
  (ctx->reg).sharp.reg162 =
       (anon_struct_4_5_ac9e8c85_for_reg162)((uint)aVar7 & 0xfffffffe | uVar124);
  uVar129 = ((src_params->shp_params).lti_h_slope & 0x1ffU) << 4;
  (ctx->reg).sharp.reg162 =
       (anon_struct_4_5_ac9e8c85_for_reg162)((uint)aVar7 & 0xffffe00e | uVar124 | uVar129);
  (ctx->reg).sharp.reg162 =
       (anon_struct_4_5_ac9e8c85_for_reg162)
       ((uint)aVar7 & 0xfe00e00e | uVar124 | uVar129 |
       ((src_params->shp_params).lti_h_thresold & 0x1ffU) << 0x10);
  uVar124 = (src_params->shp_params).lti_h_noise_thr_neg & 0x3ff;
  aVar9 = (ctx->reg).sharp.reg163;
  (ctx->reg).sharp.reg163 =
       (anon_struct_4_5_e9729c4a_for_reg163)((uint)aVar9 & 0xfffffc00 | uVar124);
  uVar129 = ((src_params->shp_params).lti_h_noise_thr_pos & 0x3ffU) << 0xc;
  (ctx->reg).sharp.reg163 =
       (anon_struct_4_5_e9729c4a_for_reg163)((uint)aVar9 & 0xffc00c00 | uVar124 | uVar129);
  (ctx->reg).sharp.reg163 =
       (anon_struct_4_5_e9729c4a_for_reg163)
       ((uint)aVar9 & 0xe0c00c00 | uVar124 | uVar129 |
       ((src_params->shp_params).lti_h_gain & 0x1fU) << 0x18);
  uVar124 = (src_params->shp_params).lti_v_radius & 1;
  (ctx->reg).sharp.reg164 =
       (anon_struct_4_5_051dd277_for_reg164)((uint)aVar8 & 0xfffffffe | uVar124);
  uVar129 = ((src_params->shp_params).lti_v_slope & 0x1ffU) << 4;
  (ctx->reg).sharp.reg164 =
       (anon_struct_4_5_051dd277_for_reg164)((uint)aVar8 & 0xffffe00e | uVar124 | uVar129);
  (ctx->reg).sharp.reg164 =
       (anon_struct_4_5_051dd277_for_reg164)
       ((uint)aVar8 & 0xfe00e00e | uVar124 | uVar129 |
       ((src_params->shp_params).lti_v_thresold & 0x1ffU) << 0x10);
  uVar124 = (src_params->shp_params).lti_v_noise_thr_neg & 0x3ff;
  aVar10 = (ctx->reg).sharp.reg165;
  (ctx->reg).sharp.reg165 =
       (anon_struct_4_5_dbe3e6bc_for_reg165)((uint)aVar10 & 0xfffffc00 | uVar124);
  uVar129 = ((src_params->shp_params).lti_v_noise_thr_pos & 0x3ffU) << 0xc;
  (ctx->reg).sharp.reg165 =
       (anon_struct_4_5_dbe3e6bc_for_reg165)((uint)aVar10 & 0xffc00c00 | uVar124 | uVar129);
  (ctx->reg).sharp.reg165 =
       (anon_struct_4_5_dbe3e6bc_for_reg165)
       ((uint)aVar10 & 0xe0c00c00 | uVar124 | uVar129 |
       ((src_params->shp_params).lti_v_gain & 0x1fU) << 0x18);
  aVar11 = (ctx->reg).sharp.reg166;
  uVar124 = (src_params->shp_params).cti_h_radius & 1;
  (ctx->reg).sharp.reg166 =
       (anon_struct_4_5_7d0670dc_for_reg166)((uint)aVar11 & 0xfffffffe | uVar124);
  uVar129 = ((src_params->shp_params).cti_h_slope & 0x1ffU) << 4;
  (ctx->reg).sharp.reg166 =
       (anon_struct_4_5_7d0670dc_for_reg166)((uint)aVar11 & 0xffffe00e | uVar124 | uVar129);
  (ctx->reg).sharp.reg166 =
       (anon_struct_4_5_7d0670dc_for_reg166)
       ((uint)aVar11 & 0xfe00e00e | uVar124 | uVar129 |
       ((src_params->shp_params).cti_h_thresold & 0x1ffU) << 0x10);
  uVar129 = (src_params->shp_params).cti_h_noise_thr_neg & 0x3ff;
  aVar12 = (ctx->reg).sharp.reg167;
  (ctx->reg).sharp.reg167 =
       (anon_struct_4_5_ee4e9261_for_reg167)((uint)aVar12 & 0xfffffc00 | uVar129);
  uVar124 = ((src_params->shp_params).cti_h_noise_thr_pos & 0x3ffU) << 0xc;
  (ctx->reg).sharp.reg167 =
       (anon_struct_4_5_ee4e9261_for_reg167)((uint)aVar12 & 0xffc00c00 | uVar129 | uVar124);
  (ctx->reg).sharp.reg167 =
       (anon_struct_4_5_ee4e9261_for_reg167)
       ((uint)aVar12 & 0xe0c00c00 | uVar129 | uVar124 |
       ((src_params->shp_params).cti_h_gain & 0x1fU) << 0x18);
  iVar147 = (src_params->shp_params).peaking_coring_enable;
  iVar126 = (src_params->shp_params).peaking_gain_enable;
  iVar149 = (src_params->shp_params).peaking_limit_ctrl_enable;
  for (lVar127 = 0; lVar127 != 0x1c; lVar127 = lVar127 + 4) {
    iVar148 = 0;
    iVar143 = 0x400;
    iVar159 = 0x400;
    iVar146 = 0;
    if (iVar147 == 1) {
      iVar159 = *(int *)((long)(src_params->shp_params).peaking_coring_ratio + lVar127);
      iVar148 = *(int *)((long)(src_params->shp_params).peaking_coring_zero + lVar127) >> 2;
      iVar146 = *(int *)((long)(src_params->shp_params).peaking_coring_thr + lVar127) >> 2;
    }
    iVar152 = 0x400;
    if (iVar126 == 1) {
      iVar143 = *(int *)((long)(src_params->shp_params).peaking_gain_pos + lVar127);
      iVar152 = *(int *)((long)(src_params->shp_params).peaking_gain_neg + lVar127);
    }
    iVar136 = 0x400;
    iVar156 = 0x3f;
    iVar125 = iVar156;
    iVar137 = iVar156;
    iVar142 = iVar156;
    if (iVar149 == 1) {
      iVar137 = *(int *)((long)(src_params->shp_params).peaking_limit_ctrl_pos0 + lVar127) >> 2;
      iVar142 = *(int *)((long)(src_params->shp_params).peaking_limit_ctrl_pos1 + lVar127) >> 2;
      iVar156 = *(int *)((long)(src_params->shp_params).peaking_limit_ctrl_neg0 + lVar127) >> 2;
      iVar125 = *(int *)((long)(src_params->shp_params).peaking_limit_ctrl_neg1 + lVar127) >> 2;
      iVar136 = *(int *)((long)(src_params->shp_params).peaking_limit_ctrl_ratio + lVar127);
    }
    iVar138 = -iVar146;
    iVar157 = -iVar156;
    iVar154 = iVar152 * iVar159 + 0x200 >> 10;
    iVar133 = iVar146 - iVar148;
    iVar155 = -(iVar154 * iVar133 + 0x200 >> 10);
    iVar153 = -iVar148;
    if (0xfe < -iVar148) {
      iVar153 = 0xff;
    }
    if (iVar153 < -0xff) {
      iVar153 = -0x100;
    }
    if (0xfe < iVar138) {
      iVar138 = 0xff;
    }
    if (iVar138 < -0xff) {
      iVar138 = -0x100;
    }
    if (0xfe < iVar157) {
      iVar157 = 0xff;
    }
    iVar150 = -0x100;
    if (iVar157 < -0xff) {
      iVar157 = iVar150;
    }
    iVar53 = -iVar125;
    if (0xfe < -iVar125) {
      iVar53 = 0xff;
    }
    *(int *)((long)peaking_ctrl_idx_N0 + lVar127) = iVar153;
    if (iVar53 < -0xff) {
      iVar53 = iVar150;
    }
    *(int *)((long)peaking_ctrl_idx_N1 + lVar127) = iVar138;
    if (0xfe < iVar148) {
      iVar148 = 0xff;
    }
    *(int *)((long)peaking_ctrl_idx_N2 + lVar127) = iVar157;
    if (iVar148 < -0xff) {
      iVar148 = iVar150;
    }
    iVar153 = 0xff;
    if (iVar146 < 0xff) {
      iVar153 = iVar146;
    }
    *(int *)((long)peaking_ctrl_idx_N3 + lVar127) = iVar53;
    if (iVar153 < -0xff) {
      iVar153 = iVar150;
    }
    iVar138 = 0xff;
    if (iVar137 < 0xff) {
      iVar138 = iVar137;
    }
    *(int *)(diff2conf_lut_k + lVar127) = iVar148;
    if (iVar138 < -0xff) {
      iVar138 = -0x100;
    }
    iVar148 = 0xff;
    if (iVar142 < 0xff) {
      iVar148 = iVar142;
    }
    *(int *)((long)peaking_ctrl_idx_P1 + lVar127) = iVar153;
    if (iVar148 < -0xff) {
      iVar148 = -0x100;
    }
    *(int *)((long)peaking_ctrl_idx_P2 + lVar127) = iVar138;
    *(int *)((long)peaking_ctrl_idx_P3 + lVar127) = iVar148;
    iVar148 = iVar155;
    if (0xfe < iVar155) {
      iVar148 = 0xff;
    }
    if (iVar148 < -0xff) {
      iVar148 = -0x100;
    }
    iVar155 = iVar155 - ((iVar156 - iVar146) * iVar152 + 0x200 >> 10);
    *(int *)((long)peaking_ctrl_value_N1 + lVar127) = iVar148;
    iVar148 = iVar155;
    if (0xfe < iVar155) {
      iVar148 = 0xff;
    }
    if (iVar148 < -0xff) {
      iVar148 = -0x100;
    }
    iVar153 = iVar136 * iVar152 + 0x200 >> 10;
    iVar155 = iVar155 - ((iVar125 - iVar156) * iVar153 + 0x200 >> 10);
    *(int *)((long)peaking_ctrl_value_N2 + lVar127) = iVar148;
    if (0xfe < iVar155) {
      iVar155 = 0xff;
    }
    if (iVar155 < -0xff) {
      iVar155 = -0x100;
    }
    iVar159 = iVar159 * iVar143 + 0x200 >> 10;
    iVar125 = iVar133 * iVar159 + 0x200 >> 10;
    *(int *)((long)peaking_ctrl_value_N3 + lVar127) = iVar155;
    iVar148 = iVar125;
    if (0xfe < iVar125) {
      iVar148 = 0xff;
    }
    if (iVar148 < -0xff) {
      iVar148 = -0x100;
    }
    iVar125 = ((iVar137 - iVar146) * iVar143 + 0x200 >> 10) + iVar125;
    *(int *)((long)peaking_ctrl_value_P1 + lVar127) = iVar148;
    iVar148 = iVar125;
    if (0xfe < iVar125) {
      iVar148 = 0xff;
    }
    if (iVar148 < -0xff) {
      iVar148 = -0x100;
    }
    iVar146 = iVar136 * iVar143 + 0x200 >> 10;
    iVar125 = ((iVar142 - iVar137) * iVar146 + 0x200 >> 10) + iVar125;
    *(int *)((long)peaking_ctrl_value_P2 + lVar127) = iVar148;
    if (0xfe < iVar125) {
      iVar125 = 0xff;
    }
    if (iVar125 < -0xff) {
      iVar125 = -0x100;
    }
    *(int *)((long)peaking_ctrl_value_P3 + lVar127) = iVar125;
    if (0xffe < iVar159) {
      iVar159 = 0xfff;
    }
    if (iVar159 < 1) {
      iVar159 = 0;
    }
    *(int *)((long)peaking_ctrl_ratio_P01 + lVar127) = iVar159;
    if (0xffe < iVar143) {
      iVar143 = 0xfff;
    }
    if (iVar143 < 1) {
      iVar143 = 0;
    }
    *(int *)((long)peaking_ctrl_ratio_P12 + lVar127) = iVar143;
    if (0xffe < iVar146) {
      iVar146 = 0xfff;
    }
    if (iVar146 < 1) {
      iVar146 = 0;
    }
    *(int *)((long)peaking_ctrl_ratio_P23 + lVar127) = iVar146;
    if (0xffe < iVar154) {
      iVar154 = 0xfff;
    }
    if (iVar154 < 1) {
      iVar154 = 0;
    }
    *(int *)((long)peaking_ctrl_ratio_N01 + lVar127) = iVar154;
    if (0xffe < iVar152) {
      iVar152 = 0xfff;
    }
    if (iVar152 < 1) {
      iVar152 = 0;
    }
    *(int *)((long)peaking_ctrl_ratio_N12 + lVar127) = iVar152;
    if (0xffe < iVar153) {
      iVar153 = 0xfff;
    }
    if (iVar153 < 1) {
      iVar153 = 0;
    }
    *(int *)((long)local_298 + lVar127) = iVar153;
  }
  aVar62 = (ctx->reg).sharp.reg13;
  aVar63 = (ctx->reg).sharp.reg14;
  aVar64 = (ctx->reg).sharp.reg15;
  aVar65 = (ctx->reg).sharp.reg16;
  aVar66 = (ctx->reg).sharp.reg17;
  aVar67 = (ctx->reg).sharp.reg18;
  aVar68 = (ctx->reg).sharp.reg19;
  (ctx->reg).sharp.reg12 =
       (anon_struct_4_3_f795cdaa_for_reg12)
       ((peaking_ctrl_idx_N1[0] & 0x1ffU) << 0x10 |
       (uint)(ctx->reg).sharp.reg12 & 0xfe00fe00 | peaking_ctrl_idx_N0[0] & 0x1ffU);
  (ctx->reg).sharp.reg13 =
       (anon_struct_4_3_f795cdea_for_reg13)
       ((peaking_ctrl_idx_N3[0] & 0x1ffU) << 0x10 |
       (uint)aVar62 & 0xfe00fe00 | peaking_ctrl_idx_N2[0] & 0x1ffU);
  (ctx->reg).sharp.reg14 =
       (anon_struct_4_3_f795d56a_for_reg14)
       ((peaking_ctrl_idx_P1[0] & 0x1ffU) << 0x10 |
       (uint)aVar63 & 0xfe00fe00 | diff2conf_lut_k._0_4_ & 0x1ff);
  (ctx->reg).sharp.reg15 =
       (anon_struct_4_3_f795d5aa_for_reg15)
       ((peaking_ctrl_idx_P3[0] & 0x1ffU) << 0x10 |
       (uint)aVar64 & 0xfe00fe00 | peaking_ctrl_idx_P2[0] & 0x1ffU);
  (ctx->reg).sharp.reg16 =
       (anon_struct_4_3_c249374a_for_reg16)
       ((peaking_ctrl_value_N2[0] & 0x1ffU) << 0x10 |
       (uint)aVar65 & 0xfe00fe00 | peaking_ctrl_value_N1[0] & 0x1ffU);
  (ctx->reg).sharp.reg17 =
       (anon_struct_4_3_c24937c5_for_reg17)
       ((peaking_ctrl_value_P1[0] & 0x1ffU) << 0x10 |
       (uint)aVar66 & 0xfe00fe00 | peaking_ctrl_value_N3[0] & 0x1ffU);
  (ctx->reg).sharp.reg18 =
       (anon_struct_4_3_c2493f2a_for_reg18)
       ((peaking_ctrl_value_P3[0] & 0x1ffU) << 0x10 |
       (uint)aVar67 & 0xfe00fe00 | peaking_ctrl_value_P2[0] & 0x1ffU);
  (ctx->reg).sharp.reg19 =
       (anon_struct_4_3_a38c4f29_for_reg19)
       ((peaking_ctrl_ratio_N12[0] & 0xfffU) << 0x10 |
       (uint)aVar68 & 0xf000f000 | peaking_ctrl_ratio_N01[0] & 0xfffU);
  (ctx->reg).sharp.reg20 =
       (anon_struct_4_3_a38c5e4b_for_reg20)
       ((peaking_ctrl_ratio_P01[0] & 0xfffU) << 0x10 |
       (uint)(ctx->reg).sharp.reg20 & 0xf000f000 | local_298[0] & 0xfff);
  (ctx->reg).sharp.reg21 =
       (anon_struct_4_2_eef66cc1_for_reg21)
       ((peaking_ctrl_ratio_P23[0] & 0xfffU) << 0xc |
       peaking_ctrl_ratio_P12[0] & 0xfffU | (uint)(byte)(ctx->reg).sharp.reg21.field_0x3 << 0x18);
  aVar69 = (ctx->reg).sharp.reg24;
  aVar70 = (ctx->reg).sharp.reg25;
  aVar71 = (ctx->reg).sharp.reg26;
  (ctx->reg).sharp.reg23 =
       (anon_struct_4_3_f3bb698a_for_reg23)
       ((peaking_ctrl_idx_N1[1] & 0x1ffU) << 0x10 |
       (uint)(ctx->reg).sharp.reg23 & 0xfe00fe00 | peaking_ctrl_idx_N0[1] & 0x1ffU);
  (ctx->reg).sharp.reg24 =
       (anon_struct_4_3_f3bb69ca_for_reg24)
       ((peaking_ctrl_idx_N3[1] & 0x1ffU) << 0x10 |
       (uint)aVar69 & 0xfe00fe00 | peaking_ctrl_idx_N2[1] & 0x1ffU);
  (ctx->reg).sharp.reg25 =
       (anon_struct_4_3_f3bb714a_for_reg25)
       ((peaking_ctrl_idx_P1[1] & 0x1ffU) << 0x10 |
       (uint)aVar70 & 0xfe00fe00 | diff2conf_lut_k._4_4_ & 0x1ff);
  (ctx->reg).sharp.reg26 =
       (anon_struct_4_3_f3bb718a_for_reg26)
       ((peaking_ctrl_idx_P3[1] & 0x1ffU) << 0x10 |
       (uint)aVar71 & 0xfe00fe00 | peaking_ctrl_idx_P2[1] & 0x1ffU);
  aVar72 = (ctx->reg).sharp.reg28;
  aVar73 = (ctx->reg).sharp.reg29;
  aVar74 = (ctx->reg).sharp.reg30;
  (ctx->reg).sharp.reg27 =
       (anon_struct_4_3_4b775b2a_for_reg27)
       ((peaking_ctrl_value_N2[1] & 0x1ffU) << 0x10 |
       (uint)(ctx->reg).sharp.reg27 & 0xfe00fe00 | peaking_ctrl_value_N1[1] & 0x1ffU);
  (ctx->reg).sharp.reg28 =
       (anon_struct_4_3_4b775ba5_for_reg28)
       ((peaking_ctrl_value_P1[1] & 0x1ffU) << 0x10 |
       (uint)aVar72 & 0xfe00fe00 | peaking_ctrl_value_N3[1] & 0x1ffU);
  (ctx->reg).sharp.reg29 =
       (anon_struct_4_3_4b77630a_for_reg29)
       ((peaking_ctrl_value_P3[1] & 0x1ffU) << 0x10 |
       (uint)aVar73 & 0xfe00fe00 | peaking_ctrl_value_P2[1] & 0x1ffU);
  (ctx->reg).sharp.reg30 =
       (anon_struct_4_3_4022a749_for_reg30)
       ((peaking_ctrl_ratio_N12[1] & 0xfffU) << 0x10 |
       (uint)aVar74 & 0xf000f000 | peaking_ctrl_ratio_N01[1] & 0xfffU);
  (ctx->reg).sharp.reg31 =
       (anon_struct_4_3_4022b66b_for_reg31)
       ((peaking_ctrl_ratio_P01[1] & 0xfffU) << 0x10 |
       (uint)(ctx->reg).sharp.reg31 & 0xf000f000 | local_298[1] & 0xfff);
  (ctx->reg).sharp.reg32 =
       (anon_struct_4_2_8b8cc4e1_for_reg32)
       ((peaking_ctrl_ratio_P23[1] & 0xfffU) << 0xc |
       peaking_ctrl_ratio_P12[1] & 0xfffU | (uint)(byte)(ctx->reg).sharp.reg32.field_0x3 << 0x18);
  aVar75 = (ctx->reg).sharp.reg35;
  aVar76 = (ctx->reg).sharp.reg36;
  aVar77 = (ctx->reg).sharp.reg37;
  (ctx->reg).sharp.reg34 =
       (anon_struct_4_3_efe1056a_for_reg34)
       ((peaking_ctrl_idx_N1[2] & 0x1ffU) << 0x10 |
       (uint)(ctx->reg).sharp.reg34 & 0xfe00fe00 | peaking_ctrl_idx_N0[2] & 0x1ffU);
  (ctx->reg).sharp.reg35 =
       (anon_struct_4_3_efe105aa_for_reg35)
       ((peaking_ctrl_idx_N3[2] & 0x1ffU) << 0x10 |
       (uint)aVar75 & 0xfe00fe00 | peaking_ctrl_idx_N2[2] & 0x1ffU);
  (ctx->reg).sharp.reg36 =
       (anon_struct_4_3_efe10d2a_for_reg36)
       ((peaking_ctrl_idx_P1[2] & 0x1ffU) << 0x10 | (uint)aVar76 & 0xfe00fe00);
  (ctx->reg).sharp.reg37 =
       (anon_struct_4_3_efe10d6a_for_reg37)
       ((peaking_ctrl_idx_P3[2] & 0x1ffU) << 0x10 |
       (uint)aVar77 & 0xfe00fe00 | peaking_ctrl_idx_P2[2] & 0x1ffU);
  aVar78 = (ctx->reg).sharp.reg39;
  aVar79 = (ctx->reg).sharp.reg40;
  aVar80 = (ctx->reg).sharp.reg41;
  (ctx->reg).sharp.reg38 =
       (anon_struct_4_3_d4a57f0a_for_reg38)
       ((peaking_ctrl_value_N2[2] & 0x1ffU) << 0x10 |
       (uint)(ctx->reg).sharp.reg38 & 0xfe00fe00 | peaking_ctrl_value_N1[2] & 0x1ffU);
  (ctx->reg).sharp.reg39 =
       (anon_struct_4_3_d4a57f85_for_reg39)
       ((peaking_ctrl_value_P1[2] & 0x1ffU) << 0x10 |
       (uint)aVar78 & 0xfe00fe00 | peaking_ctrl_value_N3[2] & 0x1ffU);
  (ctx->reg).sharp.reg40 =
       (anon_struct_4_3_d4a586ea_for_reg40)
       ((peaking_ctrl_value_P3[2] & 0x1ffU) << 0x10 |
       (uint)aVar79 & 0xfe00fe00 | peaking_ctrl_value_P2[2] & 0x1ffU);
  (ctx->reg).sharp.reg41 =
       (anon_struct_4_3_dcb8ff69_for_reg41)
       ((peaking_ctrl_ratio_N12[2] & 0xfffU) << 0x10 |
       (uint)aVar80 & 0xf000f000 | peaking_ctrl_ratio_N01[2] & 0xfffU);
  (ctx->reg).sharp.reg42 =
       (anon_struct_4_3_dcb90e8b_for_reg42)
       ((peaking_ctrl_ratio_P01[2] & 0xfffU) << 0x10 |
       (uint)(ctx->reg).sharp.reg42 & 0xf000f000 | local_298[2] & 0xfff);
  (ctx->reg).sharp.reg43 =
       (anon_struct_4_2_28231d01_for_reg43)
       ((peaking_ctrl_ratio_P23[2] & 0xfffU) << 0xc |
       peaking_ctrl_ratio_P12[2] & 0xfffU | (uint)(byte)(ctx->reg).sharp.reg43.field_0x3 << 0x18);
  aVar81 = (ctx->reg).sharp.reg46;
  aVar82 = (ctx->reg).sharp.reg47;
  aVar83 = (ctx->reg).sharp.reg48;
  (ctx->reg).sharp.reg45 =
       (anon_struct_4_3_ec06a14a_for_reg45)
       ((peaking_ctrl_idx_N1[3] & 0x1ffU) << 0x10 |
       (uint)(ctx->reg).sharp.reg45 & 0xfe00fe00 | peaking_ctrl_idx_N0[3] & 0x1ffU);
  (ctx->reg).sharp.reg46 =
       (anon_struct_4_3_ec06a18a_for_reg46)
       ((peaking_ctrl_idx_N3[3] & 0x1ffU) << 0x10 |
       (uint)aVar81 & 0xfe00fe00 | peaking_ctrl_idx_N2[3] & 0x1ffU);
  (ctx->reg).sharp.reg47 =
       (anon_struct_4_3_ec06a90a_for_reg47)
       ((peaking_ctrl_idx_P1[3] & 0x1ffU) << 0x10 | (uint)aVar82 & 0xfe00fe00);
  (ctx->reg).sharp.reg48 =
       (anon_struct_4_3_ec06a94a_for_reg48)
       ((peaking_ctrl_idx_P3[3] & 0x1ffU) << 0x10 |
       (uint)aVar83 & 0xfe00fe00 | peaking_ctrl_idx_P2[3] & 0x1ffU);
  aVar84 = (ctx->reg).sharp.reg50;
  aVar85 = (ctx->reg).sharp.reg51;
  aVar86 = (ctx->reg).sharp.reg52;
  (ctx->reg).sharp.reg49 =
       (anon_struct_4_3_5dd3a2ea_for_reg49)
       ((peaking_ctrl_value_N2[3] & 0x1ffU) << 0x10 |
       (uint)(ctx->reg).sharp.reg49 & 0xfe00fe00 | peaking_ctrl_value_N1[3] & 0x1ffU);
  (ctx->reg).sharp.reg50 =
       (anon_struct_4_3_5dd3a365_for_reg50)
       ((peaking_ctrl_value_P1[3] & 0x1ffU) << 0x10 |
       (uint)aVar84 & 0xfe00fe00 | peaking_ctrl_value_N3[3] & 0x1ffU);
  (ctx->reg).sharp.reg51 =
       (anon_struct_4_3_5dd3aaca_for_reg51)
       ((peaking_ctrl_value_P3[3] & 0x1ffU) << 0x10 |
       (uint)aVar85 & 0xfe00fe00 | peaking_ctrl_value_P2[3] & 0x1ffU);
  (ctx->reg).sharp.reg52 =
       (anon_struct_4_3_794f5789_for_reg52)
       ((peaking_ctrl_ratio_N12[3] & 0xfffU) << 0x10 |
       (uint)aVar86 & 0xf000f000 | peaking_ctrl_ratio_N01[3] & 0xfffU);
  (ctx->reg).sharp.reg53 =
       (anon_struct_4_3_794f66ab_for_reg53)
       ((peaking_ctrl_ratio_P01[3] & 0xfffU) << 0x10 |
       (uint)(ctx->reg).sharp.reg53 & 0xf000f000 | local_298[3] & 0xfff);
  (ctx->reg).sharp.reg54 =
       (anon_struct_4_2_c4b97521_for_reg54)
       ((peaking_ctrl_ratio_P23[3] & 0xfffU) << 0xc |
       peaking_ctrl_ratio_P12[3] & 0xfffU | (uint)(byte)(ctx->reg).sharp.reg54.field_0x3 << 0x18);
  aVar87 = (ctx->reg).sharp.reg57;
  aVar88 = (ctx->reg).sharp.reg58;
  aVar89 = (ctx->reg).sharp.reg59;
  (ctx->reg).sharp.reg56 =
       (anon_struct_4_3_e82c3d2a_for_reg56)
       ((peaking_ctrl_idx_N1[4] & 0x1ffU) << 0x10 |
       (uint)(ctx->reg).sharp.reg56 & 0xfe00fe00 | peaking_ctrl_idx_N0[4] & 0x1ffU);
  (ctx->reg).sharp.reg57 =
       (anon_struct_4_3_e82c3d6a_for_reg57)
       ((peaking_ctrl_idx_N3[4] & 0x1ffU) << 0x10 |
       (uint)aVar87 & 0xfe00fe00 | peaking_ctrl_idx_N2[4] & 0x1ffU);
  (ctx->reg).sharp.reg58 =
       (anon_struct_4_3_e82c44ea_for_reg58)
       ((peaking_ctrl_idx_P1[4] & 0x1ffU) << 0x10 | (uint)aVar88 & 0xfe00fe00);
  (ctx->reg).sharp.reg59 =
       (anon_struct_4_3_e82c452a_for_reg59)
       ((peaking_ctrl_idx_P3[4] & 0x1ffU) << 0x10 |
       (uint)aVar89 & 0xfe00fe00 | peaking_ctrl_idx_P2[4] & 0x1ffU);
  aVar90 = (ctx->reg).sharp.reg61;
  aVar91 = (ctx->reg).sharp.reg62;
  aVar92 = (ctx->reg).sharp.reg63;
  (ctx->reg).sharp.reg60 =
       (anon_struct_4_3_e701c6ca_for_reg60)
       ((peaking_ctrl_value_N2[4] & 0x1ffU) << 0x10 |
       (uint)(ctx->reg).sharp.reg60 & 0xfe00fe00 | peaking_ctrl_value_N1[4] & 0x1ffU);
  (ctx->reg).sharp.reg61 =
       (anon_struct_4_3_e701c745_for_reg61)
       ((peaking_ctrl_value_P1[4] & 0x1ffU) << 0x10 |
       (uint)aVar90 & 0xfe00fe00 | peaking_ctrl_value_N3[4] & 0x1ffU);
  (ctx->reg).sharp.reg62 =
       (anon_struct_4_3_e701ceaa_for_reg62)
       ((peaking_ctrl_value_P3[4] & 0x1ffU) << 0x10 |
       (uint)aVar91 & 0xfe00fe00 | peaking_ctrl_value_P2[4] & 0x1ffU);
  (ctx->reg).sharp.reg63 =
       (anon_struct_4_3_15e5afa9_for_reg63)
       ((peaking_ctrl_ratio_N12[4] & 0xfffU) << 0x10 |
       (uint)aVar92 & 0xf000f000 | peaking_ctrl_ratio_N01[4] & 0xfffU);
  (ctx->reg).sharp.reg64 =
       (anon_struct_4_3_15e5becb_for_reg64)
       ((peaking_ctrl_ratio_P01[4] & 0xfffU) << 0x10 |
       (uint)(ctx->reg).sharp.reg64 & 0xf000f000 | local_298[4] & 0xfff);
  (ctx->reg).sharp.reg65 =
       (anon_struct_4_2_614fcd41_for_reg65)
       ((peaking_ctrl_ratio_P23[4] & 0xfffU) << 0xc |
       peaking_ctrl_ratio_P12[4] & 0xfffU | (uint)(byte)(ctx->reg).sharp.reg65.field_0x3 << 0x18);
  aVar93 = (ctx->reg).sharp.reg68;
  aVar94 = (ctx->reg).sharp.reg69;
  aVar95 = (ctx->reg).sharp.reg70;
  (ctx->reg).sharp.reg67 =
       (anon_struct_4_3_e451d90a_for_reg67)
       ((peaking_ctrl_idx_N1[5] & 0x1ffU) << 0x10 |
       (uint)(ctx->reg).sharp.reg67 & 0xfe00fe00 | peaking_ctrl_idx_N0[5] & 0x1ffU);
  (ctx->reg).sharp.reg68 =
       (anon_struct_4_3_e451d94a_for_reg68)
       ((peaking_ctrl_idx_N3[5] & 0x1ffU) << 0x10 |
       (uint)aVar93 & 0xfe00fe00 | peaking_ctrl_idx_N2[5] & 0x1ffU);
  (ctx->reg).sharp.reg69 =
       (anon_struct_4_3_e451e0ca_for_reg69)
       ((peaking_ctrl_idx_P1[5] & 0x1ffU) << 0x10 | (uint)aVar94 & 0xfe00fe00);
  (ctx->reg).sharp.reg70 =
       (anon_struct_4_3_e451e10a_for_reg70)
       ((peaking_ctrl_idx_P3[5] & 0x1ffU) << 0x10 |
       (uint)aVar95 & 0xfe00fe00 | peaking_ctrl_idx_P2[5] & 0x1ffU);
  aVar96 = (ctx->reg).sharp.reg72;
  aVar97 = (ctx->reg).sharp.reg73;
  aVar98 = (ctx->reg).sharp.reg74;
  (ctx->reg).sharp.reg71 =
       (anon_struct_4_3_702feaaa_for_reg71)
       ((peaking_ctrl_value_N2[5] & 0x1ffU) << 0x10 |
       (uint)(ctx->reg).sharp.reg71 & 0xfe00fe00 | peaking_ctrl_value_N1[5] & 0x1ffU);
  (ctx->reg).sharp.reg72 =
       (anon_struct_4_3_702feb25_for_reg72)
       ((peaking_ctrl_value_P1[5] & 0x1ffU) << 0x10 |
       (uint)aVar96 & 0xfe00fe00 | peaking_ctrl_value_N3[5] & 0x1ffU);
  (ctx->reg).sharp.reg73 =
       (anon_struct_4_3_702ff28a_for_reg73)
       ((peaking_ctrl_value_P3[5] & 0x1ffU) << 0x10 |
       (uint)aVar97 & 0xfe00fe00 | peaking_ctrl_value_P2[5] & 0x1ffU);
  (ctx->reg).sharp.reg74 =
       (anon_struct_4_3_b27c07c9_for_reg74)
       ((peaking_ctrl_ratio_N12[5] & 0xfffU) << 0x10 |
       (uint)aVar98 & 0xf000f000 | peaking_ctrl_ratio_N01[5] & 0xfffU);
  (ctx->reg).sharp.reg75 =
       (anon_struct_4_3_b27c16eb_for_reg75)
       ((peaking_ctrl_ratio_P01[5] & 0xfffU) << 0x10 |
       (uint)(ctx->reg).sharp.reg75 & 0xf000f000 | local_298[5] & 0xfff);
  (ctx->reg).sharp.reg76 =
       (anon_struct_4_2_fde62561_for_reg76)
       ((peaking_ctrl_ratio_P23[5] & 0xfffU) << 0xc |
       peaking_ctrl_ratio_P12[5] & 0xfffU | (uint)(byte)(ctx->reg).sharp.reg76.field_0x3 << 0x18);
  aVar104 = (ctx->reg).sharp.reg79;
  aVar105 = (ctx->reg).sharp.reg80;
  aVar106 = (ctx->reg).sharp.reg81;
  (ctx->reg).sharp.reg78 =
       (anon_struct_4_3_e07774ea_for_reg78)
       ((peaking_ctrl_idx_N1[6] & 0xfffU) << 0x10 |
       (uint)(ctx->reg).sharp.reg78 & 0xf000f000 | peaking_ctrl_idx_N0[6] & 0xfffU);
  (ctx->reg).sharp.reg79 =
       (anon_struct_4_3_e077752a_for_reg79)
       ((peaking_ctrl_idx_N3[6] & 0x1ffU) << 0x10 |
       (uint)aVar104 & 0xfe00fe00 | peaking_ctrl_idx_N2[6] & 0x1ffU);
  (ctx->reg).sharp.reg80 =
       (anon_struct_4_3_e0777caa_for_reg80)
       ((peaking_ctrl_idx_P1[6] & 0x1ffU) << 0x10 | (uint)aVar105 & 0xfe00fe00);
  (ctx->reg).sharp.reg81 =
       (anon_struct_4_3_e0777cea_for_reg81)
       ((peaking_ctrl_idx_P3[6] & 0x1ffU) << 0x10 |
       (uint)aVar106 & 0xfe00fe00 | peaking_ctrl_idx_P2[6] & 0x1ffU);
  aVar99 = (ctx->reg).sharp.reg83;
  aVar100 = (ctx->reg).sharp.reg84;
  aVar101 = (ctx->reg).sharp.reg85;
  (ctx->reg).sharp.reg82 =
       (anon_struct_4_3_f95e0e8a_for_reg82)
       ((peaking_ctrl_value_N2[6] & 0x1ffU) << 0x10 |
       (uint)(ctx->reg).sharp.reg82 & 0xfe00fe00 | peaking_ctrl_value_N1[6] & 0x1ffU);
  (ctx->reg).sharp.reg83 =
       (anon_struct_4_3_f95e0f05_for_reg83)
       ((peaking_ctrl_value_P1[6] & 0x1ffU) << 0x10 |
       (uint)aVar99 & 0xfe00fe00 | peaking_ctrl_value_N3[6] & 0x1ffU);
  (ctx->reg).sharp.reg84 =
       (anon_struct_4_3_f95e166a_for_reg84)
       ((peaking_ctrl_value_P3[6] & 0x1ffU) << 0x10 |
       (uint)aVar100 & 0xfe00fe00 | peaking_ctrl_value_P2[6] & 0x1ffU);
  (ctx->reg).sharp.reg85 =
       (anon_struct_4_3_4f125fe9_for_reg85)
       ((peaking_ctrl_ratio_N12[6] & 0xfffU) << 0x10 |
       (uint)aVar101 & 0xf000f000 | peaking_ctrl_ratio_N01[6] & 0xfffU);
  (ctx->reg).sharp.reg86 =
       (anon_struct_4_3_4f126f0b_for_reg86)
       ((peaking_ctrl_ratio_P01[6] & 0xfffU) << 0x10 |
       (uint)(ctx->reg).sharp.reg86 & 0xf000f000 | local_298[6] & 0xfff);
  (ctx->reg).sharp.reg87 =
       (anon_struct_4_2_9a7c7d81_for_reg87)
       ((peaking_ctrl_ratio_P23[6] & 0xfffU) << 0xc |
       peaking_ctrl_ratio_P12[6] & 0xfffU | (uint)(byte)(ctx->reg).sharp.reg87.field_0x3 << 0x18);
  aVar13 = (ctx->reg).sharp.reg2;
  uVar124 = (src_params->shp_params).peaking_filt_core_V0[0] & 0xf;
  (ctx->reg).sharp.reg2 = (anon_struct_4_6_fef62f20_for_reg2)((uint)aVar13 & 0xfffffff0 | uVar124);
  uVar129 = ((src_params->shp_params).peaking_filt_core_V0[1] & 0xfU) << 4;
  (ctx->reg).sharp.reg2 =
       (anon_struct_4_6_fef62f20_for_reg2)((uint)aVar13 & 0xffffff00 | uVar124 | uVar129);
  uVar145 = ((src_params->shp_params).peaking_filt_core_V0[2] & 0xfU) << 8;
  (ctx->reg).sharp.reg2 =
       (anon_struct_4_6_fef62f20_for_reg2)((uint)aVar13 & 0xfffff000 | uVar124 | uVar129 | uVar145);
  uVar144 = ((src_params->shp_params).peaking_filt_core_V1[0] & 0xfU) << 0xc;
  (ctx->reg).sharp.reg2 =
       (anon_struct_4_6_fef62f20_for_reg2)
       ((uint)aVar13 & 0xffff0000 | uVar124 | uVar129 | uVar145 | uVar144);
  uVar130 = ((src_params->shp_params).peaking_filt_core_V1[1] & 0xfU) << 0x10;
  (ctx->reg).sharp.reg2 =
       (anon_struct_4_6_fef62f20_for_reg2)
       ((uint)aVar13 & 0xfff00000 | uVar124 | uVar129 | uVar145 | uVar144 | uVar130);
  (ctx->reg).sharp.reg2 =
       (anon_struct_4_6_fef62f20_for_reg2)
       ((uint)aVar13 & 0xff000000 | uVar124 | uVar129 | uVar145 | uVar144 | uVar130 |
       ((src_params->shp_params).peaking_filt_core_V1[2] & 0xfU) << 0x14);
  aVar14 = (ctx->reg).sharp.reg3;
  uVar124 = (src_params->shp_params).peaking_filt_core_V2[0] & 0xf;
  (ctx->reg).sharp.reg3 = (anon_struct_4_7_566f0ca7_for_reg3)((uint)aVar14 & 0xfffffff0 | uVar124);
  uVar129 = ((src_params->shp_params).peaking_filt_core_V2[1] & 0xfU) << 4;
  (ctx->reg).sharp.reg3 =
       (anon_struct_4_7_566f0ca7_for_reg3)((uint)aVar14 & 0xffffff00 | uVar124 | uVar129);
  uVar145 = ((src_params->shp_params).peaking_filt_core_V2[2] & 0xfU) << 8;
  (ctx->reg).sharp.reg3 =
       (anon_struct_4_7_566f0ca7_for_reg3)((uint)aVar14 & 0xfffff000 | uVar124 | uVar129 | uVar145);
  uVar144 = ((src_params->shp_params).peaking_filt_core_USM[0] & 0xfU) << 0xc;
  (ctx->reg).sharp.reg3 =
       (anon_struct_4_7_566f0ca7_for_reg3)
       ((uint)aVar14 & 0xffff0000 | uVar124 | uVar129 | uVar145 | uVar144);
  uVar130 = ((src_params->shp_params).peaking_filt_core_USM[1] & 0xfU) << 0x10;
  (ctx->reg).sharp.reg3 =
       (anon_struct_4_7_566f0ca7_for_reg3)
       ((uint)aVar14 & 0xfff00000 | uVar124 | uVar129 | uVar145 | uVar144 | uVar130);
  uVar140 = ((src_params->shp_params).peaking_filt_core_USM[2] & 0xfU) << 0x14;
  (ctx->reg).sharp.reg3 =
       (anon_struct_4_7_566f0ca7_for_reg3)
       ((uint)aVar14 & 0xff000000 | uVar124 | uVar129 | uVar145 | uVar144 | uVar130 | uVar140);
  (ctx->reg).sharp.reg3 =
       (anon_struct_4_7_566f0ca7_for_reg3)
       ((uint)aVar14 & 0xf8000000 | uVar124 | uVar129 | uVar145 | uVar144 | uVar130 | uVar140 |
       ((src_params->shp_params).peaking_filter_cfg_diag_enh_coef & 7U) << 0x18);
  aVar15 = (ctx->reg).sharp.reg4;
  uVar124 = (src_params->shp_params).peaking_filt_core_H0[0] & 0x3f;
  (ctx->reg).sharp.reg4 = (anon_struct_4_5_5206536f_for_reg4)((uint)aVar15 & 0xffffffc0 | uVar124);
  uVar129 = ((src_params->shp_params).peaking_filt_core_H0[1] & 0x3fU) << 8;
  (ctx->reg).sharp.reg4 =
       (anon_struct_4_5_5206536f_for_reg4)((uint)aVar15 & 0xffffc0c0 | uVar124 | uVar129);
  (ctx->reg).sharp.reg4 =
       (anon_struct_4_5_5206536f_for_reg4)
       ((uint)aVar15 & 0xffc0c0c0 | uVar124 | uVar129 |
       ((src_params->shp_params).peaking_filt_core_H0[2] & 0x3fU) << 0x10);
  aVar16 = (ctx->reg).sharp.reg6;
  uVar124 = (src_params->shp_params).peaking_filt_core_H1[0] & 0x3f;
  (ctx->reg).sharp.reg6 = (anon_struct_4_5_5206cbae_for_reg6)((uint)aVar16 & 0xffffffc0 | uVar124);
  uVar129 = ((src_params->shp_params).peaking_filt_core_H1[1] & 0x3fU) << 8;
  (ctx->reg).sharp.reg6 =
       (anon_struct_4_5_5206cbae_for_reg6)((uint)aVar16 & 0xffffc0c0 | uVar124 | uVar129);
  (ctx->reg).sharp.reg6 =
       (anon_struct_4_5_5206cbae_for_reg6)
       ((uint)aVar16 & 0xffc0c0c0 | uVar124 | uVar129 |
       ((src_params->shp_params).peaking_filt_core_H1[2] & 0x3fU) << 0x10);
  aVar17 = (ctx->reg).sharp.reg8;
  uVar124 = (src_params->shp_params).peaking_filt_core_H2[0] & 0x3f;
  (ctx->reg).sharp.reg8 = (anon_struct_4_5_520743ed_for_reg8)((uint)aVar17 & 0xffffffc0 | uVar124);
  uVar129 = ((src_params->shp_params).peaking_filt_core_H2[1] & 0x3fU) << 8;
  (ctx->reg).sharp.reg8 =
       (anon_struct_4_5_520743ed_for_reg8)((uint)aVar17 & 0xffffc0c0 | uVar124 | uVar129);
  (ctx->reg).sharp.reg8 =
       (anon_struct_4_5_520743ed_for_reg8)
       ((uint)aVar17 & 0xffc0c0c0 | uVar124 | uVar129 |
       ((src_params->shp_params).peaking_filt_core_H2[2] & 0x3fU) << 0x10);
  uVar124 = (src_params->shp_params).peaking_gain & 0x3ff;
  aVar18 = (ctx->reg).sharp.reg100;
  (ctx->reg).sharp.reg100 =
       (anon_struct_4_6_6b67bfe3_for_reg100)((uint)aVar18 & 0xfffffc00 | uVar124);
  uVar129 = ((src_params->shp_params).peaking_edge_ctrl_non_dir_thr & 0x7fU) << 0xc;
  (ctx->reg).sharp.reg100 =
       (anon_struct_4_6_6b67bfe3_for_reg100)((uint)aVar18 & 0xfff80c00 | uVar124 | uVar129);
  uVar145 = ((src_params->shp_params).peaking_edge_ctrl_dir_cmp_ratio & 0xfU) << 0x14;
  (ctx->reg).sharp.reg100 =
       (anon_struct_4_6_6b67bfe3_for_reg100)
       ((uint)aVar18 & 0xff080c00 | uVar124 | uVar129 | uVar145);
  (ctx->reg).sharp.reg100 =
       (anon_struct_4_6_6b67bfe3_for_reg100)
       ((uint)aVar18 & 0xe0080c00 | uVar124 | uVar129 | uVar145 |
       ((src_params->shp_params).peaking_edge_ctrl_non_dir_wgt_ratio & 0x1fU) << 0x18);
  aVar54._1_3_ = SUB43((ctx->reg).sharp.reg101,1);
  aVar54._0_1_ = (char)(src_params->shp_params).peaking_edge_ctrl_non_dir_wgt_offset;
  (ctx->reg).sharp.reg101 = aVar54;
  uVar124 = ((src_params->shp_params).peaking_edge_ctrl_dir_cnt_thr & 0xfU) << 8;
  (ctx->reg).sharp.reg101 =
       (anon_struct_4_6_05954ecb_for_reg101)((uint)aVar54 & 0xfffff0ff | uVar124);
  uVar129 = ((src_params->shp_params).peaking_edge_ctrl_dir_cnt_avg & 7U) << 0xc;
  (ctx->reg).sharp.reg101 =
       (anon_struct_4_6_05954ecb_for_reg101)((uint)aVar54 & 0xffff80ff | uVar124 | uVar129);
  uVar145 = ((src_params->shp_params).peaking_edge_ctrl_dir_cnt_offset & 0xfU) << 0x10;
  (ctx->reg).sharp.reg101 =
       (anon_struct_4_6_05954ecb_for_reg101)
       ((uint)aVar54 & 0xfff080ff | uVar124 | uVar129 | uVar145);
  (ctx->reg).sharp.reg101 =
       (anon_struct_4_6_05954ecb_for_reg101)
       ((uint)aVar54 & 0xf80080ff | uVar124 | uVar129 | uVar145 |
       ((src_params->shp_params).peaking_edge_ctrl_diag_dir_thr & 0x7fU) << 0x14);
  aVar19 = (ctx->reg).sharp.reg102;
  uVar140 = (src_params->shp_params).peaking_edge_ctrl_diag_adj_gain_tab[0] & 0xf;
  (ctx->reg).sharp.reg102 =
       (anon_struct_4_8_1448ed05_for_reg102)((uint)aVar19 & 0xfffffff0 | uVar140);
  uVar131 = ((src_params->shp_params).peaking_edge_ctrl_diag_adj_gain_tab[1] & 0xfU) << 4;
  (ctx->reg).sharp.reg102 =
       (anon_struct_4_8_1448ed05_for_reg102)((uint)aVar19 & 0xffffff00 | uVar140 | uVar131);
  uVar124 = ((src_params->shp_params).peaking_edge_ctrl_diag_adj_gain_tab[2] & 0xfU) << 8;
  (ctx->reg).sharp.reg102 =
       (anon_struct_4_8_1448ed05_for_reg102)
       ((uint)aVar19 & 0xfffff000 | uVar140 | uVar131 | uVar124);
  uVar129 = ((src_params->shp_params).peaking_edge_ctrl_diag_adj_gain_tab[3] & 0xfU) << 0xc;
  (ctx->reg).sharp.reg102 =
       (anon_struct_4_8_1448ed05_for_reg102)
       ((uint)aVar19 & 0xffff0000 | uVar140 | uVar131 | uVar124 | uVar129);
  uVar145 = ((src_params->shp_params).peaking_edge_ctrl_diag_adj_gain_tab[4] & 0xfU) << 0x10;
  (ctx->reg).sharp.reg102 =
       (anon_struct_4_8_1448ed05_for_reg102)
       ((uint)aVar19 & 0xfff00000 | uVar140 | uVar131 | uVar124 | uVar129 | uVar145);
  uVar144 = ((src_params->shp_params).peaking_edge_ctrl_diag_adj_gain_tab[5] & 0xfU) << 0x14;
  (ctx->reg).sharp.reg102 =
       (anon_struct_4_8_1448ed05_for_reg102)
       ((uint)aVar19 & 0xff000000 | uVar140 | uVar131 | uVar124 | uVar129 | uVar145 | uVar144);
  uVar130 = ((src_params->shp_params).peaking_edge_ctrl_diag_adj_gain_tab[6] & 0xfU) << 0x18;
  (ctx->reg).sharp.reg102 =
       (anon_struct_4_8_1448ed05_for_reg102)
       ((uint)aVar19 & 0xf0000000 | uVar140 | uVar131 | uVar124 | uVar129 | uVar145 | uVar144 |
       uVar130);
  (ctx->reg).sharp.reg102 =
       (anon_struct_4_8_1448ed05_for_reg102)
       (uVar140 | uVar131 | uVar124 | uVar129 | uVar145 | uVar144 | uVar130 |
       (src_params->shp_params).peaking_edge_ctrl_diag_adj_gain_tab[7] << 0x1c);
  aVar20 = (ctx->reg).sharp.reg103;
  uVar124 = (src_params->shp_params).peaking_estc_alpha_over_non & 0x7f;
  (ctx->reg).sharp.reg103 =
       (anon_struct_4_7_51a04710_for_reg103)((uint)aVar20 & 0xffffff80 | uVar124);
  uVar129 = ((src_params->shp_params).peaking_estc_alpha_under_non & 0x7fU) << 8;
  (ctx->reg).sharp.reg103 =
       (anon_struct_4_7_51a04710_for_reg103)((uint)aVar20 & 0xffff8080 | uVar124 | uVar129);
  uVar145 = ((src_params->shp_params).peaking_estc_alpha_over_unlimit_non & 0x7fU) << 0x10;
  (ctx->reg).sharp.reg103 =
       (anon_struct_4_7_51a04710_for_reg103)
       ((uint)aVar20 & 0xff808080 | uVar124 | uVar129 | uVar145);
  (ctx->reg).sharp.reg103 =
       (anon_struct_4_7_51a04710_for_reg103)
       ((uint)aVar20 & 0x80808080 | uVar124 | uVar129 | uVar145 |
       ((src_params->shp_params).peaking_estc_alpha_under_unlimit_non & 0x7fU) << 0x18);
  aVar21 = (ctx->reg).sharp.reg104;
  uVar124 = (src_params->shp_params).peaking_estc_alpha_over_v & 0x7f;
  (ctx->reg).sharp.reg104 =
       (anon_struct_4_7_f4a15204_for_reg104)((uint)aVar21 & 0xffffff80 | uVar124);
  uVar129 = ((src_params->shp_params).peaking_estc_alpha_under_v & 0x7fU) << 8;
  (ctx->reg).sharp.reg104 =
       (anon_struct_4_7_f4a15204_for_reg104)((uint)aVar21 & 0xffff8080 | uVar124 | uVar129);
  uVar145 = ((src_params->shp_params).peaking_estc_alpha_over_unlimit_v & 0x7fU) << 0x10;
  (ctx->reg).sharp.reg104 =
       (anon_struct_4_7_f4a15204_for_reg104)
       ((uint)aVar21 & 0xff808080 | uVar124 | uVar129 | uVar145);
  (ctx->reg).sharp.reg104 =
       (anon_struct_4_7_f4a15204_for_reg104)
       ((uint)aVar21 & 0x80808080 | uVar124 | uVar129 | uVar145 |
       ((src_params->shp_params).peaking_estc_alpha_under_unlimit_v & 0x7fU) << 0x18);
  aVar22 = (ctx->reg).sharp.reg105;
  uVar124 = (src_params->shp_params).peaking_estc_alpha_over_h & 0x7f;
  (ctx->reg).sharp.reg105 =
       (anon_struct_4_7_13dfdf50_for_reg105)((uint)aVar22 & 0xffffff80 | uVar124);
  uVar129 = ((src_params->shp_params).peaking_estc_alpha_under_h & 0x7fU) << 8;
  (ctx->reg).sharp.reg105 =
       (anon_struct_4_7_13dfdf50_for_reg105)((uint)aVar22 & 0xffff8080 | uVar124 | uVar129);
  uVar145 = ((src_params->shp_params).peaking_estc_alpha_over_unlimit_h & 0x7fU) << 0x10;
  (ctx->reg).sharp.reg105 =
       (anon_struct_4_7_13dfdf50_for_reg105)
       ((uint)aVar22 & 0xff808080 | uVar124 | uVar129 | uVar145);
  (ctx->reg).sharp.reg105 =
       (anon_struct_4_7_13dfdf50_for_reg105)
       ((uint)aVar22 & 0x80808080 | uVar124 | uVar129 | uVar145 |
       ((src_params->shp_params).peaking_estc_alpha_under_unlimit_h & 0x7fU) << 0x18);
  aVar23 = (ctx->reg).sharp.reg106;
  uVar124 = (src_params->shp_params).peaking_estc_alpha_over_d0 & 0x7f;
  (ctx->reg).sharp.reg106 =
       (anon_struct_4_7_15216c04_for_reg106)((uint)aVar23 & 0xffffff80 | uVar124);
  uVar129 = ((src_params->shp_params).peaking_estc_alpha_under_d0 & 0x7fU) << 8;
  (ctx->reg).sharp.reg106 =
       (anon_struct_4_7_15216c04_for_reg106)((uint)aVar23 & 0xffff8080 | uVar124 | uVar129);
  uVar145 = ((src_params->shp_params).peaking_estc_alpha_over_unlimit_d0 & 0x7fU) << 0x10;
  (ctx->reg).sharp.reg106 =
       (anon_struct_4_7_15216c04_for_reg106)
       ((uint)aVar23 & 0xff808080 | uVar124 | uVar129 | uVar145);
  (ctx->reg).sharp.reg106 =
       (anon_struct_4_7_15216c04_for_reg106)
       ((uint)aVar23 & 0x80808080 | uVar124 | uVar129 | uVar145 |
       ((src_params->shp_params).peaking_estc_alpha_under_unlimit_d0 & 0x7fU) << 0x18);
  aVar24 = (ctx->reg).sharp.reg107;
  uVar124 = (src_params->shp_params).peaking_estc_alpha_over_d1 & 0x7f;
  (ctx->reg).sharp.reg107 =
       (anon_struct_4_7_1521e444_for_reg107)((uint)aVar24 & 0xffffff80 | uVar124);
  uVar129 = ((src_params->shp_params).peaking_estc_alpha_under_d1 & 0x7fU) << 8;
  (ctx->reg).sharp.reg107 =
       (anon_struct_4_7_1521e444_for_reg107)((uint)aVar24 & 0xffff8080 | uVar124 | uVar129);
  uVar145 = ((src_params->shp_params).peaking_estc_alpha_over_unlimit_d1 & 0x7fU) << 0x10;
  (ctx->reg).sharp.reg107 =
       (anon_struct_4_7_1521e444_for_reg107)
       ((uint)aVar24 & 0xff808080 | uVar124 | uVar129 | uVar145);
  (ctx->reg).sharp.reg107 =
       (anon_struct_4_7_1521e444_for_reg107)
       ((uint)aVar24 & 0x80808080 | uVar124 | uVar129 | uVar145 |
       ((src_params->shp_params).peaking_estc_alpha_under_unlimit_d1 & 0x7fU) << 0x18);
  aVar55._1_3_ = SUB43((ctx->reg).sharp.reg108,1);
  aVar55._0_1_ = (char)(src_params->shp_params).peaking_estc_delta_offset_non;
  (ctx->reg).sharp.reg108 = aVar55;
  uVar124 = ((src_params->shp_params).peaking_estc_delta_offset_v & 0xffU) << 8;
  (ctx->reg).sharp.reg108 =
       (anon_struct_4_3_724851b1_for_reg108)((uint)aVar55 & 0xffff00ff | uVar124);
  (ctx->reg).sharp.reg108 =
       (anon_struct_4_3_724851b1_for_reg108)
       ((uint)aVar55 & 0xff0000ff | uVar124 |
       ((src_params->shp_params).peaking_estc_delta_offset_h & 0xffU) << 0x10);
  RVar25 = (src_params->shp_params).peaking_estc_delta_offset_d0;
  *(char *)&(ctx->reg).sharp.reg109 = (char)RVar25;
  *(ushort *)&(ctx->reg).sharp.reg109 =
       (ushort)((src_params->shp_params).peaking_estc_delta_offset_d1 << 8) | (ushort)RVar25 & 0xff;
  aVar26 = (ctx->reg).sharp.reg110;
  uVar124 = (src_params->shp_params).shootctrl_filter_radius & 1;
  (ctx->reg).sharp.reg110 =
       (anon_struct_4_6_98c00d60_for_reg110)((uint)aVar26 & 0xfffffffe | uVar124);
  uVar129 = ((src_params->shp_params).shootctrl_delta_offset & 0xffU) << 4;
  (ctx->reg).sharp.reg110 =
       (anon_struct_4_6_98c00d60_for_reg110)((uint)aVar26 & 0xfffff00e | uVar124 | uVar129);
  uVar145 = ((src_params->shp_params).shootctrl_alpha_over & 0x7fU) << 0xc;
  (ctx->reg).sharp.reg110 =
       (anon_struct_4_6_98c00d60_for_reg110)
       ((uint)aVar26 & 0xfff8000e | uVar124 | uVar129 | uVar145);
  (ctx->reg).sharp.reg110 =
       (anon_struct_4_6_98c00d60_for_reg110)
       ((uint)aVar26 & 0xf808000e | uVar124 | uVar129 | uVar145 |
       ((src_params->shp_params).shootctrl_alpha_under & 0x7fU) << 0x14);
  uVar139 = (ushort)(src_params->shp_params).shootctrl_alpha_over_unlimit & 0x7f;
  uVar128 = SUB42((ctx->reg).sharp.reg111,0);
  *(ushort *)&(ctx->reg).sharp.reg111 = uVar128 & 0xff80 | uVar139;
  *(ushort *)&(ctx->reg).sharp.reg111 =
       uVar128 & 0x8080 | uVar139 |
       (ushort)(((src_params->shp_params).shootctrl_alpha_under_unlimit & 0x7fU) << 8);
  uVar140 = (uint)(src_params->shp_params).global_gain_adp_grd[1] >> 2 & 0xff;
  aVar27 = (ctx->reg).sharp.reg112;
  (ctx->reg).sharp.reg112 =
       (anon_struct_4_5_4e72b6e0_for_reg112)((uint)aVar27 & 0xffffff00 | uVar140);
  uVar124 = (src_params->shp_params).global_gain_adp_grd[2];
  uVar145 = (uVar124 & 0x3fc) << 8;
  (ctx->reg).sharp.reg112 =
       (anon_struct_4_5_4e72b6e0_for_reg112)((uint)aVar27 & 0xfffc0300 | uVar140 | uVar145);
  uVar129 = (src_params->shp_params).global_gain_adp_grd[3];
  (ctx->reg).sharp.reg112 =
       (anon_struct_4_5_4e72b6e0_for_reg112)
       ((uint)aVar27 & 0xf00c0300 | uVar140 | uVar145 | (uVar129 & 0x3fc) << 0x12);
  uVar145 = (uint)(src_params->shp_params).global_gain_adp_grd[4] >> 2 & 0xff;
  aVar28 = (ctx->reg).sharp.reg113;
  (ctx->reg).sharp.reg113 =
       (anon_struct_4_5_de9b1aa1_for_reg113)((uint)aVar28 & 0xffffff00 | uVar145);
  uVar130 = (src_params->shp_params).global_gain_adp_val[0] & 0x7f;
  uVar144 = uVar130 << 0xc;
  (ctx->reg).sharp.reg113 =
       (anon_struct_4_5_de9b1aa1_for_reg113)((uint)aVar28 & 0xfff80f00 | uVar145 | uVar144);
  uVar160 = (src_params->shp_params).global_gain_adp_val[1] & 0x7f;
  (ctx->reg).sharp.reg113 =
       (anon_struct_4_5_de9b1aa1_for_reg113)
       ((uint)aVar28 & 0xf8080f00 | uVar145 | uVar144 | uVar160 << 0x14);
  uVar131 = (src_params->shp_params).global_gain_adp_val[2] & 0x7f;
  aVar29 = (ctx->reg).sharp.reg114;
  (ctx->reg).sharp.reg114 =
       (anon_struct_4_5_8d760384_for_reg114)((uint)aVar29 & 0xffffff80 | uVar131);
  uVar135 = (src_params->shp_params).global_gain_adp_val[3] & 0x7f;
  (ctx->reg).sharp.reg114 =
       (anon_struct_4_5_8d760384_for_reg114)((uint)aVar29 & 0xffff8080 | uVar131 | uVar135 << 8);
  uVar144 = (src_params->shp_params).global_gain_adp_val[4] & 0x7f;
  fVar173 = ((float)(int)(uVar160 - uVar130) * 128.0) / (float)(uVar140 + (uVar140 == 0));
  (ctx->reg).sharp.reg114 =
       (anon_struct_4_5_8d760384_for_reg114)
       ((uint)aVar29 & 0xff808080 | uVar131 | uVar135 << 8 | uVar144 << 0x10);
  fVar166 = 0.5;
  fVar168 = 0.5;
  if (fVar173 <= 0.0) {
    fVar168 = -0.5;
  }
  uVar124 = uVar124 >> 2 & 0xff;
  iVar147 = uVar124 - uVar140;
  if (iVar147 < 2) {
    iVar147 = 1;
  }
  fVar175 = ((float)(int)(uVar131 - uVar160) * 128.0) / (float)iVar147;
  fVar172 = 0.5;
  if (fVar175 <= 0.0) {
    fVar172 = -0.5;
  }
  uVar129 = uVar129 >> 2 & 0xff;
  iVar147 = uVar129 - uVar124;
  if (iVar147 < 2) {
    iVar147 = 1;
  }
  fVar174 = ((float)(int)(uVar135 - uVar131) * 128.0) / (float)iVar147;
  fVar190 = 0.5;
  if (fVar174 <= 0.0) {
    fVar190 = -0.5;
  }
  iVar147 = uVar145 - uVar129;
  if (iVar147 < 2) {
    iVar147 = 1;
  }
  fVar177 = ((float)(int)(uVar144 - uVar135) * 128.0) / (float)iVar147;
  fVar61 = 0.5;
  if (fVar177 <= 0.0) {
    fVar61 = -0.5;
  }
  uVar124 = (uint)(fVar168 + fVar173);
  uVar130 = (uint)(fVar172 + fVar175);
  uVar129 = (uint)(fVar190 + fVar174);
  uVar140 = (uint)(fVar61 + fVar177);
  fVar173 = ((float)(int)((src_params->shp_params).global_gain_adp_val[5] - uVar144) * 128.0) /
            (float)((uVar145 ^ 0xff) + (uint)((uVar145 ^ 0xff) == 0));
  fVar168 = 0.5;
  if (fVar173 <= 0.0) {
    fVar168 = -0.5;
  }
  uVar145 = (uint)(fVar168 + fVar173);
  if (0x3fe < (int)uVar124) {
    uVar124 = 0x3ff;
  }
  if ((int)uVar124 < -0x3ff) {
    uVar124 = 0xfffffc00;
  }
  if (0x3fe < (int)uVar130) {
    uVar130 = 0x3ff;
  }
  if ((int)uVar130 < -0x3ff) {
    uVar130 = 0xfffffc00;
  }
  if (0x3fe < (int)uVar129) {
    uVar129 = 0x3ff;
  }
  if ((int)uVar129 < -0x3ff) {
    uVar129 = 0xfffffc00;
  }
  (ctx->reg).sharp.reg115 =
       (anon_struct_4_3_f9f4ffc9_for_reg115)
       ((uVar130 & 0x7ff) << 0xc | (uint)(ctx->reg).sharp.reg115 & 0xff800800 | uVar124 & 0x7ff);
  if (0x3fe < (int)uVar140) {
    uVar140 = 0x3ff;
  }
  if ((int)uVar140 < -0x3ff) {
    uVar140 = 0xfffffc00;
  }
  (ctx->reg).sharp.reg128 =
       (anon_struct_4_3_f9f507c9_for_reg128)
       ((uVar140 & 0x7ff) << 0xc | (uint)(ctx->reg).sharp.reg128 & 0xff800800 | uVar129 & 0x7ff);
  if (0x3fe < (int)uVar145) {
    uVar145 = 0x3ff;
  }
  if ((int)uVar145 < -0x3ff) {
    uVar145 = 0xfffffc00;
  }
  uVar145 = uVar145 & 0x7ff;
  aVar30 = (ctx->reg).sharp.reg129;
  (ctx->reg).sharp.reg129 =
       (anon_struct_4_4_9babbec2_for_reg129)((uint)aVar30 & 0xfffff800 | uVar145);
  uVar124 = (src_params->shp_params).global_gain_var_grd[1];
  uVar144 = (uVar124 & 0x3fc) << 9;
  (ctx->reg).sharp.reg129 =
       (anon_struct_4_4_9babbec2_for_reg129)((uint)aVar30 & 0xfff80000 | uVar145 | uVar144);
  uVar129 = (src_params->shp_params).global_gain_var_grd[2];
  (ctx->reg).sharp.reg129 =
       (anon_struct_4_4_9babbec2_for_reg129)
       ((uint)aVar30 & 0xe0180000 | uVar145 | uVar144 | (uVar129 & 0x3fc) << 0x13);
  uVar144 = (uint)(src_params->shp_params).global_gain_var_grd[3] >> 2 & 0xff;
  aVar31 = (ctx->reg).sharp.reg130;
  (ctx->reg).sharp.reg130 =
       (anon_struct_4_5_7a7ec4dc_for_reg130)((uint)aVar31 & 0xffffff00 | uVar144);
  uVar145 = (src_params->shp_params).global_gain_var_grd[4];
  uVar130 = (uVar145 & 0x3fc) << 10;
  (ctx->reg).sharp.reg130 =
       (anon_struct_4_5_7a7ec4dc_for_reg130)((uint)aVar31 & 0xfff00f00 | uVar144 | uVar130);
  uVar158 = (src_params->shp_params).global_gain_var_val[0] & 0x7f;
  (ctx->reg).sharp.reg130 =
       (anon_struct_4_5_7a7ec4dc_for_reg130)
       ((uint)aVar31 & 0x80f00f00 | uVar144 | uVar130 | uVar158 << 0x18);
  aVar32 = (ctx->reg).sharp.reg131;
  uVar161 = (src_params->shp_params).global_gain_var_val[1] & 0x7f;
  (ctx->reg).sharp.reg131 =
       (anon_struct_4_7_35acda4c_for_reg131)((uint)aVar32 & 0xffffff80 | uVar161);
  uVar130 = (src_params->shp_params).global_gain_var_val[2] & 0x7f;
  uVar135 = uVar130 << 8;
  (ctx->reg).sharp.reg131 =
       (anon_struct_4_7_35acda4c_for_reg131)((uint)aVar32 & 0xffff8080 | uVar161 | uVar135);
  uVar160 = (src_params->shp_params).global_gain_var_val[3] & 0x7f;
  (ctx->reg).sharp.reg131 =
       (anon_struct_4_7_35acda4c_for_reg131)
       ((uint)aVar32 & 0xff808080 | uVar161 | uVar135 | uVar160 << 0x10);
  uVar151 = (src_params->shp_params).global_gain_var_val[4] & 0x7f;
  uVar131 = uVar124 >> 2 & 0xff;
  uVar140 = 1;
  iVar147 = uVar131 + (uVar131 == 0);
  uVar129 = uVar129 >> 2 & 0xff;
  uVar124 = uVar144 - uVar129;
  uVar129 = uVar129 - uVar131;
  if ((int)uVar129 < 2) {
    uVar129 = uVar140;
  }
  if ((int)uVar124 < 2) {
    uVar124 = uVar140;
  }
  (ctx->reg).sharp.reg131 =
       (anon_struct_4_7_35acda4c_for_reg131)
       ((uint)aVar32 & 0x80808080 | uVar161 | uVar135 | uVar160 << 0x10 | uVar151 << 0x18);
  uVar145 = uVar145 >> 2 & 0xff;
  uVar144 = uVar145 - uVar144;
  if ((int)uVar144 < 2) {
    uVar144 = uVar140;
  }
  uVar145 = uVar145 ^ 0xff;
  fVar173 = ((float)(int)((src_params->shp_params).global_gain_var_val[5] - uVar151) * 128.0) /
            (float)(uVar145 + (uVar145 == 0));
  fVar168 = 0.5;
  if (fVar173 <= 0.0) {
    fVar168 = -0.5;
  }
  uVar145 = (uint)(fVar168 + fVar173);
  fVar168 = (float)(int)(uVar161 - uVar158) * 128.0;
  fVar172 = (float)(int)(uVar160 - uVar130) * 128.0;
  auVar178._4_4_ = uVar124;
  auVar178._0_4_ = iVar147;
  auVar178._8_8_ = 0;
  auVar184._0_4_ = (float)iVar147;
  auVar184._4_4_ = (float)(int)uVar124;
  auVar184._8_8_ = 0;
  auVar179 = rcpps(auVar178,auVar184);
  fVar173 = fVar168 * auVar179._0_4_;
  fVar175 = fVar172 * auVar179._4_4_;
  fVar173 = (fVar168 - auVar184._0_4_ * fVar173) * auVar179._0_4_ + fVar173;
  fVar175 = (fVar172 - auVar184._4_4_ * fVar175) * auVar179._4_4_ + fVar175;
  uVar124 = -(uint)(0.0 < fVar173);
  uVar140 = -(uint)(0.0 < fVar175);
  auVar107._4_8_ = 0;
  auVar107._0_4_ = uVar124 & 0x3fe00000;
  auVar187._0_12_ = auVar107 << 0x20;
  auVar187._12_4_ = uVar140 & 0x3fe00000;
  auVar108._4_8_ = 0;
  auVar108._0_4_ = ~uVar124 & 0xbfe00000;
  auVar180._0_12_ = auVar108 << 0x20;
  auVar180._12_4_ = ~uVar140 & 0xbfe00000;
  uVar140 = (uint)(SUB168(auVar180 | auVar187,0) + (double)fVar173);
  uVar131 = (uint)(SUB168(auVar180 | auVar187,8) + (double)fVar175);
  fVar168 = (float)(int)(uVar130 - uVar161) * 128.0;
  fVar172 = (float)(int)(uVar151 - uVar160) * 128.0;
  auVar179._0_4_ = (float)(int)uVar129;
  auVar179._4_4_ = (float)(int)uVar144;
  auVar179._8_8_ = 0;
  auVar184 = rcpps(ZEXT416(uVar144),auVar179);
  fVar173 = fVar168 * auVar184._0_4_;
  fVar175 = fVar172 * auVar184._4_4_;
  fVar173 = (fVar168 - auVar179._0_4_ * fVar173) * auVar184._0_4_ + fVar173;
  fVar175 = (fVar172 - auVar179._4_4_ * fVar175) * auVar184._4_4_ + fVar175;
  uVar124 = -(uint)(0.0 < fVar173);
  uVar129 = -(uint)(0.0 < fVar175);
  auVar109._4_8_ = 0;
  auVar109._0_4_ = uVar124 & 0x3fe00000;
  auVar185._0_12_ = auVar109 << 0x20;
  auVar185._12_4_ = uVar129 & 0x3fe00000;
  auVar110._4_8_ = 0;
  auVar110._0_4_ = ~uVar124 & 0xbfe00000;
  auVar176._0_12_ = auVar110 << 0x20;
  auVar176._12_4_ = ~uVar129 & 0xbfe00000;
  uVar135 = (uint)(SUB168(auVar176 | auVar185,0) + (double)fVar173);
  uVar160 = (uint)(SUB168(auVar176 | auVar185,8) + (double)fVar175);
  uVar124 = -(uint)((int)uVar140 < 0x3ff);
  uVar129 = -(uint)((int)uVar131 < 0x3ff);
  uVar140 = ~uVar124 & 0x3ff | uVar140 & uVar124;
  uVar131 = ~uVar129 & 0x3ff | uVar131 & uVar129;
  uVar124 = -(uint)(-0x400 < (int)uVar140);
  uVar144 = -(uint)(-0x400 < (int)uVar131);
  aVar103 = (ctx->reg).sharp.reg133;
  uVar129 = -(uint)((int)uVar135 < 0x3ff);
  uVar130 = -(uint)((int)uVar160 < 0x3ff);
  uVar129 = ~uVar129 & 0x3ff | uVar135 & uVar129;
  uVar130 = ~uVar130 & 0x3ff | uVar160 & uVar130;
  uVar135 = -(uint)(-0x400 < (int)uVar129);
  uVar160 = -(uint)(-0x400 < (int)uVar130);
  (ctx->reg).sharp.reg132 =
       (anon_struct_4_3_72b65f09_for_reg132)
       (((~uVar135 & 0xfffffc00 | uVar129 & uVar135) & 0x7ff) << 0xc |
       (uint)(ctx->reg).sharp.reg132 & 0xff800800 |
       (~uVar124 & 0xfffffc00 | uVar140 & uVar124) & 0x7ff);
  (ctx->reg).sharp.reg133 =
       (anon_struct_4_3_72b66709_for_reg133)
       (((~uVar160 & 0xfffffc00 | uVar130 & uVar160) & 0x7ff) << 0xc |
       (uint)aVar103 & 0xff800800 | (~uVar144 & 0xfffffc00 | uVar131 & uVar144) & 0x7ff);
  if (0x3fe < (int)uVar145) {
    uVar145 = 0x3ff;
  }
  if ((int)uVar145 < -0x3ff) {
    uVar145 = 0xfffffc00;
  }
  aVar33 = (ctx->reg).sharp.reg134;
  uVar145 = uVar145 & 0x7ff;
  (ctx->reg).sharp.reg134 =
       (anon_struct_4_5_713fce19_for_reg134)((uint)aVar33 & 0xfffff800 | uVar145);
  uVar129 = ((src_params->shp_params).global_gain_lum_mode & 3U) << 0x10;
  (ctx->reg).sharp.reg134 =
       (anon_struct_4_5_713fce19_for_reg134)((uint)aVar33 & 0xfffcf800 | uVar145 | uVar129);
  uVar124 = (src_params->shp_params).global_gain_lum_grd[1];
  (ctx->reg).sharp.reg134 =
       (anon_struct_4_5_713fce19_for_reg134)
       ((uint)aVar33 & 0xf00cf800 | uVar145 | uVar129 | (uVar124 & 0x3fc) << 0x12);
  uVar135 = (uint)(src_params->shp_params).global_gain_lum_grd[2] >> 2 & 0xff;
  aVar34 = (ctx->reg).sharp.reg135;
  (ctx->reg).sharp.reg135 =
       (anon_struct_4_5_098cd0aa_for_reg135)((uint)aVar34 & 0xffffff00 | uVar135);
  uVar129 = (src_params->shp_params).global_gain_lum_grd[3];
  uVar144 = (uVar129 & 0x3fc) << 8;
  (ctx->reg).sharp.reg135 =
       (anon_struct_4_5_098cd0aa_for_reg135)((uint)aVar34 & 0xfffc0300 | uVar135 | uVar144);
  uVar145 = (src_params->shp_params).global_gain_lum_grd[4];
  (ctx->reg).sharp.reg135 =
       (anon_struct_4_5_098cd0aa_for_reg135)
       ((uint)aVar34 & 0xf00c0300 | uVar135 | uVar144 | (uVar145 & 0x3fc) << 0x12);
  aVar35 = (ctx->reg).sharp.reg136;
  uVar140 = (src_params->shp_params).global_gain_lum_val[0] & 0x7f;
  (ctx->reg).sharp.reg136 =
       (anon_struct_4_7_7222c14c_for_reg136)((uint)aVar35 & 0xffffff80 | uVar140);
  uVar131 = (src_params->shp_params).global_gain_lum_val[1] & 0x7f;
  uVar144 = uVar131 << 8;
  (ctx->reg).sharp.reg136 =
       (anon_struct_4_7_7222c14c_for_reg136)((uint)aVar35 & 0xffff8080 | uVar140 | uVar144);
  uVar130 = (src_params->shp_params).global_gain_lum_val[2] & 0x7f;
  (ctx->reg).sharp.reg136 =
       (anon_struct_4_7_7222c14c_for_reg136)
       ((uint)aVar35 & 0xff808080 | uVar140 | uVar144 | uVar130 << 0x10);
  uVar160 = (src_params->shp_params).global_gain_lum_val[3] & 0x7f;
  (ctx->reg).sharp.reg136 =
       (anon_struct_4_7_7222c14c_for_reg136)
       ((uint)aVar35 & 0x80808080 | uVar140 | uVar144 | uVar130 << 0x10 | uVar160 << 0x18);
  uVar144 = (src_params->shp_params).global_gain_lum_val[4] & 0x7f;
  aVar141 = (anon_struct_4_5_4b644edc_for_reg137)
            ((uint)(ctx->reg).sharp.reg137 & 0xffffff80 | uVar144);
  uVar124 = uVar124 >> 2 & 0xff;
  (ctx->reg).sharp.reg137 = aVar141;
  fVar173 = ((float)(int)(uVar131 - uVar140) * 128.0) / (float)(uVar124 + (uVar124 == 0));
  fVar168 = 0.5;
  if (fVar173 <= 0.0) {
    fVar168 = -0.5;
  }
  iVar147 = uVar135 - uVar124;
  if ((int)(uVar135 - uVar124) < 2) {
    iVar147 = 1;
  }
  uVar124 = uVar129 >> 2 & 0xff;
  iVar126 = uVar124 - uVar135;
  if (iVar126 < 2) {
    iVar126 = 1;
  }
  fVar175 = ((float)(int)(uVar160 - uVar130) * 128.0) / (float)iVar126;
  fVar172 = 0.5;
  if (fVar175 <= 0.0) {
    fVar172 = -0.5;
  }
  iVar126 = (int)(fVar168 + fVar173);
  iVar149 = (int)(fVar172 + fVar175);
  uVar129 = uVar145 >> 2 & 0xff;
  iVar159 = uVar129 - uVar124;
  if (iVar159 < 2) {
    iVar159 = 1;
  }
  uVar129 = uVar129 ^ 0xff;
  fVar173 = ((float)(int)((src_params->shp_params).global_gain_lum_val[5] - uVar144) * 128.0) /
            (float)(uVar129 + (uVar129 == 0));
  fVar168 = 0.5;
  if (fVar173 <= 0.0) {
    fVar168 = -0.5;
  }
  if (0x3fe < iVar126) {
    iVar126 = 0x3ff;
  }
  iVar143 = (int)(fVar168 + fVar173);
  if (iVar126 < -0x3ff) {
    iVar126 = -0x400;
  }
  if (0x3fe < iVar149) {
    iVar149 = 0x3ff;
  }
  iVar148 = -0x400;
  if (iVar149 < -0x3ff) {
    iVar149 = iVar148;
  }
  fVar168 = (float)(int)(uVar130 - uVar131) * 128.0;
  fVar172 = (float)(int)(uVar144 - uVar160) * 128.0;
  auVar186._4_4_ = iVar159;
  auVar186._0_4_ = iVar147;
  auVar186._8_8_ = 0;
  auVar181._0_4_ = (float)iVar147;
  auVar181._4_4_ = (float)iVar159;
  auVar181._8_8_ = 0;
  auVar184 = rcpps(auVar186,auVar181);
  fVar173 = fVar168 * auVar184._0_4_;
  fVar175 = fVar172 * auVar184._4_4_;
  fVar173 = (fVar168 - auVar181._0_4_ * fVar173) * auVar184._0_4_ + fVar173;
  fVar175 = (fVar172 - auVar181._4_4_ * fVar175) * auVar184._4_4_ + fVar175;
  uVar124 = -(uint)(0.0 < fVar173);
  uVar129 = -(uint)(0.0 < fVar175);
  auVar111._4_8_ = 0;
  auVar111._0_4_ = uVar124 & 0x3fe00000;
  auVar189._0_12_ = auVar111 << 0x20;
  auVar189._12_4_ = uVar129 & 0x3fe00000;
  auVar112._4_8_ = 0;
  auVar112._0_4_ = ~uVar124 & 0xbfe00000;
  auVar182._0_12_ = auVar112 << 0x20;
  auVar182._12_4_ = ~uVar129 & 0xbfe00000;
  uVar124 = (uint)(SUB168(auVar182 | auVar189,0) + (double)fVar173);
  uVar129 = (uint)(SUB168(auVar182 | auVar189,8) + (double)fVar175);
  uVar145 = -(uint)((int)uVar124 < 0x3ff);
  uVar144 = -(uint)((int)uVar129 < 0x3ff);
  uVar145 = ~uVar145 & 0x3ff | uVar124 & uVar145;
  uVar144 = ~uVar144 & 0x3ff | uVar129 & uVar144;
  uVar124 = -(uint)(-0x400 < (int)uVar145);
  uVar129 = -(uint)(-0x400 < (int)uVar144);
  if (0x3fe < iVar143) {
    iVar143 = 0x3ff;
  }
  uVar183 = CONCAT44((~uVar129 & 0xfffffc00 | uVar144 & uVar129) << 0xc,
                     (~uVar124 & 0xfffffc00 | uVar145 & uVar124) << 0x14) & (ulong)DAT_00151430 |
            CONCAT44((ctx->reg).sharp.reg138,aVar141) & (ulong)DAT_00151420 |
            CONCAT44(iVar149,iVar126 << 8) & (ulong)DAT_00151410;
  if (iVar143 < -0x3ff) {
    iVar143 = iVar148;
  }
  (ctx->reg).sharp.reg137 = (anon_struct_4_5_4b644edc_for_reg137)(int)uVar183;
  (ctx->reg).sharp.reg138 = (anon_struct_4_3_c036caa9_for_reg138)(int)(uVar183 >> 0x20);
  *(ushort *)&(ctx->reg).sharp.reg139 =
       *(ushort *)&(ctx->reg).sharp.reg139 & 0xf800 | (ushort)iVar143 & 0x7ff;
  aVar56._1_3_ = SUB43((ctx->reg).sharp.reg140,1);
  aVar56._0_1_ = (char)(src_params->shp_params).color_ctrl_p0_point_u;
  (ctx->reg).sharp.reg140 = aVar56;
  uVar124 = ((src_params->shp_params).color_ctrl_p0_point_v & 0xffU) << 0xc;
  (ctx->reg).sharp.reg140 =
       (anon_struct_4_5_7839e156_for_reg140)((uint)aVar56 & 0xfff00fff | uVar124);
  (ctx->reg).sharp.reg140 =
       (anon_struct_4_5_7839e156_for_reg140)
       ((uint)aVar56 & 0xf8f00fff | uVar124 |
       ((src_params->shp_params).color_ctrl_p0_scaling_coef & 7U) << 0x18);
  aVar36 = (ctx->reg).sharp.reg141;
  uVar124 = (src_params->shp_params).color_ctrl_p0_roll_tab[0] & 0x1f;
  (ctx->reg).sharp.reg141 =
       (anon_struct_4_6_1794af64_for_reg141)((uint)aVar36 & 0xffffffe0 | uVar124);
  uVar129 = ((src_params->shp_params).color_ctrl_p0_roll_tab[1] & 0x1fU) << 5;
  (ctx->reg).sharp.reg141 =
       (anon_struct_4_6_1794af64_for_reg141)((uint)aVar36 & 0xfffffc00 | uVar124 | uVar129);
  uVar145 = ((src_params->shp_params).color_ctrl_p0_roll_tab[2] & 0x1fU) << 10;
  (ctx->reg).sharp.reg141 =
       (anon_struct_4_6_1794af64_for_reg141)
       ((uint)aVar36 & 0xffff8000 | uVar124 | uVar129 | uVar145);
  uVar144 = ((src_params->shp_params).color_ctrl_p0_roll_tab[3] & 0x1fU) << 0xf;
  (ctx->reg).sharp.reg141 =
       (anon_struct_4_6_1794af64_for_reg141)
       ((uint)aVar36 & 0xfff00000 | uVar124 | uVar129 | uVar145 | uVar144);
  uVar130 = ((src_params->shp_params).color_ctrl_p0_roll_tab[4] & 0x1fU) << 0x14;
  (ctx->reg).sharp.reg141 =
       (anon_struct_4_6_1794af64_for_reg141)
       ((uint)aVar36 & 0xfe000000 | uVar124 | uVar129 | uVar145 | uVar144 | uVar130);
  (ctx->reg).sharp.reg141 =
       (anon_struct_4_6_1794af64_for_reg141)
       ((uint)aVar36 & 0xc0000000 | uVar124 | uVar129 | uVar145 | uVar144 | uVar130 |
       ((src_params->shp_params).color_ctrl_p0_roll_tab[5] & 0x1fU) << 0x19);
  uVar124 = (src_params->shp_params).color_ctrl_p0_roll_tab[6] & 0x1f;
  aVar37 = (ctx->reg).sharp.reg142;
  (ctx->reg).sharp.reg142 =
       (anon_struct_4_6_e5dd6b84_for_reg142)((uint)aVar37 & 0xffffffe0 | uVar124);
  uVar129 = ((src_params->shp_params).color_ctrl_p0_roll_tab[7] & 0x1fU) << 5;
  (ctx->reg).sharp.reg142 =
       (anon_struct_4_6_e5dd6b84_for_reg142)((uint)aVar37 & 0xfffffc00 | uVar124 | uVar129);
  uVar145 = ((src_params->shp_params).color_ctrl_p0_roll_tab[8] & 0x1fU) << 10;
  (ctx->reg).sharp.reg142 =
       (anon_struct_4_6_e5dd6b84_for_reg142)
       ((uint)aVar37 & 0xffff8000 | uVar124 | uVar129 | uVar145);
  uVar144 = ((src_params->shp_params).color_ctrl_p0_roll_tab[9] & 0x1fU) << 0xf;
  (ctx->reg).sharp.reg142 =
       (anon_struct_4_6_e5dd6b84_for_reg142)
       ((uint)aVar37 & 0xfff00000 | uVar124 | uVar129 | uVar145 | uVar144);
  uVar130 = ((src_params->shp_params).color_ctrl_p0_roll_tab[10] & 0x1fU) << 0x14;
  (ctx->reg).sharp.reg142 =
       (anon_struct_4_6_e5dd6b84_for_reg142)
       ((uint)aVar37 & 0xfe000000 | uVar124 | uVar129 | uVar145 | uVar144 | uVar130);
  (ctx->reg).sharp.reg142 =
       (anon_struct_4_6_e5dd6b84_for_reg142)
       ((uint)aVar37 & 0xc0000000 | uVar124 | uVar129 | uVar145 | uVar144 | uVar130 |
       ((src_params->shp_params).color_ctrl_p0_roll_tab[0xb] & 0x1fU) << 0x19);
  uVar124 = (src_params->shp_params).color_ctrl_p0_roll_tab[0xc] & 0x1f;
  aVar38 = (ctx->reg).sharp.reg143;
  (ctx->reg).sharp.reg143 =
       (anon_struct_4_4_f8f30d03_for_reg143)((uint)aVar38 & 0xffffffe0 | uVar124);
  uVar129 = ((src_params->shp_params).color_ctrl_p0_roll_tab[0xd] & 0x1fU) << 5;
  (ctx->reg).sharp.reg143 =
       (anon_struct_4_4_f8f30d03_for_reg143)((uint)aVar38 & 0xfffffc00 | uVar124 | uVar129);
  uVar145 = ((src_params->shp_params).color_ctrl_p0_roll_tab[0xe] & 0x1fU) << 10;
  (ctx->reg).sharp.reg143 =
       (anon_struct_4_4_f8f30d03_for_reg143)
       ((uint)aVar38 & 0xffff8000 | uVar124 | uVar129 | uVar145);
  (ctx->reg).sharp.reg143 =
       (anon_struct_4_4_f8f30d03_for_reg143)
       ((uint)aVar38 & 0xfff00000 | uVar124 | uVar129 | uVar145 |
       ((src_params->shp_params).color_ctrl_p0_roll_tab[0xf] & 0x1fU) << 0xf);
  aVar57._1_3_ = SUB43((ctx->reg).sharp.reg144,1);
  aVar57._0_1_ = (char)(src_params->shp_params).color_ctrl_p1_point_u;
  (ctx->reg).sharp.reg144 = aVar57;
  uVar124 = ((src_params->shp_params).color_ctrl_p1_point_v & 0xffU) << 0xc;
  (ctx->reg).sharp.reg144 =
       (anon_struct_4_5_7839e537_for_reg144)((uint)aVar57 & 0xfff00fff | uVar124);
  (ctx->reg).sharp.reg144 =
       (anon_struct_4_5_7839e537_for_reg144)
       ((uint)aVar57 & 0xf8f00fff | uVar124 |
       ((src_params->shp_params).color_ctrl_p1_scaling_coef & 7U) << 0x18);
  uVar124 = (src_params->shp_params).color_ctrl_p1_roll_tab[0] & 0x1f;
  aVar39 = (ctx->reg).sharp.reg145;
  (ctx->reg).sharp.reg145 =
       (anon_struct_4_6_b61f7fc4_for_reg145)((uint)aVar39 & 0xffffffe0 | uVar124);
  uVar129 = ((src_params->shp_params).color_ctrl_p1_roll_tab[1] & 0x1fU) << 5;
  (ctx->reg).sharp.reg145 =
       (anon_struct_4_6_b61f7fc4_for_reg145)((uint)aVar39 & 0xfffffc00 | uVar124 | uVar129);
  uVar145 = ((src_params->shp_params).color_ctrl_p1_roll_tab[2] & 0x1fU) << 10;
  (ctx->reg).sharp.reg145 =
       (anon_struct_4_6_b61f7fc4_for_reg145)
       ((uint)aVar39 & 0xffff8000 | uVar124 | uVar129 | uVar145);
  uVar144 = ((src_params->shp_params).color_ctrl_p1_roll_tab[3] & 0x1fU) << 0xf;
  (ctx->reg).sharp.reg145 =
       (anon_struct_4_6_b61f7fc4_for_reg145)
       ((uint)aVar39 & 0xfff00000 | uVar124 | uVar129 | uVar145 | uVar144);
  uVar130 = ((src_params->shp_params).color_ctrl_p1_roll_tab[4] & 0x1fU) << 0x14;
  (ctx->reg).sharp.reg145 =
       (anon_struct_4_6_b61f7fc4_for_reg145)
       ((uint)aVar39 & 0xfe000000 | uVar124 | uVar129 | uVar145 | uVar144 | uVar130);
  (ctx->reg).sharp.reg145 =
       (anon_struct_4_6_b61f7fc4_for_reg145)
       ((uint)aVar39 & 0xc0000000 | uVar124 | uVar129 | uVar145 | uVar144 | uVar130 |
       ((src_params->shp_params).color_ctrl_p1_roll_tab[5] & 0x1fU) << 0x19);
  uVar124 = (src_params->shp_params).color_ctrl_p1_roll_tab[6] & 0x1f;
  aVar40 = (ctx->reg).sharp.reg146;
  (ctx->reg).sharp.reg146 =
       (anon_struct_4_6_e3c66fa4_for_reg146)((uint)aVar40 & 0xffffffe0 | uVar124);
  uVar129 = ((src_params->shp_params).color_ctrl_p1_roll_tab[7] & 0x1fU) << 5;
  (ctx->reg).sharp.reg146 =
       (anon_struct_4_6_e3c66fa4_for_reg146)((uint)aVar40 & 0xfffffc00 | uVar124 | uVar129);
  uVar145 = ((src_params->shp_params).color_ctrl_p1_roll_tab[8] & 0x1fU) << 10;
  (ctx->reg).sharp.reg146 =
       (anon_struct_4_6_e3c66fa4_for_reg146)
       ((uint)aVar40 & 0xffff8000 | uVar124 | uVar129 | uVar145);
  uVar144 = ((src_params->shp_params).color_ctrl_p1_roll_tab[9] & 0x1fU) << 0xf;
  (ctx->reg).sharp.reg146 =
       (anon_struct_4_6_e3c66fa4_for_reg146)
       ((uint)aVar40 & 0xfff00000 | uVar124 | uVar129 | uVar145 | uVar144);
  uVar130 = ((src_params->shp_params).color_ctrl_p1_roll_tab[10] & 0x1fU) << 0x14;
  (ctx->reg).sharp.reg146 =
       (anon_struct_4_6_e3c66fa4_for_reg146)
       ((uint)aVar40 & 0xfe000000 | uVar124 | uVar129 | uVar145 | uVar144 | uVar130);
  (ctx->reg).sharp.reg146 =
       (anon_struct_4_6_e3c66fa4_for_reg146)
       ((uint)aVar40 & 0xc0000000 | uVar124 | uVar129 | uVar145 | uVar144 | uVar130 |
       ((src_params->shp_params).color_ctrl_p1_roll_tab[0xb] & 0x1fU) << 0x19);
  uVar124 = (src_params->shp_params).color_ctrl_p1_roll_tab[0xc] & 0x1f;
  aVar41 = (ctx->reg).sharp.reg147;
  (ctx->reg).sharp.reg147 =
       (anon_struct_4_4_2f9cacc3_for_reg147)((uint)aVar41 & 0xffffffe0 | uVar124);
  uVar129 = ((src_params->shp_params).color_ctrl_p1_roll_tab[0xd] & 0x1fU) << 5;
  (ctx->reg).sharp.reg147 =
       (anon_struct_4_4_2f9cacc3_for_reg147)((uint)aVar41 & 0xfffffc00 | uVar124 | uVar129);
  uVar145 = ((src_params->shp_params).color_ctrl_p1_roll_tab[0xe] & 0x1fU) << 10;
  (ctx->reg).sharp.reg147 =
       (anon_struct_4_4_2f9cacc3_for_reg147)
       ((uint)aVar41 & 0xffff8000 | uVar124 | uVar129 | uVar145);
  (ctx->reg).sharp.reg147 =
       (anon_struct_4_4_2f9cacc3_for_reg147)
       ((uint)aVar41 & 0xfff00000 | uVar124 | uVar129 | uVar145 |
       ((src_params->shp_params).color_ctrl_p1_roll_tab[0xf] & 0x1fU) << 0xf);
  aVar58._1_3_ = SUB43((ctx->reg).sharp.reg148,1);
  aVar58._0_1_ = (char)(src_params->shp_params).color_ctrl_p2_point_u;
  (ctx->reg).sharp.reg148 = aVar58;
  uVar124 = ((src_params->shp_params).color_ctrl_p2_point_v & 0xffU) << 0xc;
  (ctx->reg).sharp.reg148 =
       (anon_struct_4_5_7839e918_for_reg148)((uint)aVar58 & 0xfff00fff | uVar124);
  (ctx->reg).sharp.reg148 =
       (anon_struct_4_5_7839e918_for_reg148)
       ((uint)aVar58 & 0xf8f00fff | uVar124 |
       ((src_params->shp_params).color_ctrl_p2_scaling_coef & 7U) << 0x18);
  uVar124 = (src_params->shp_params).color_ctrl_p2_roll_tab[0] & 0x1f;
  aVar42 = (ctx->reg).sharp.reg149;
  (ctx->reg).sharp.reg149 =
       (anon_struct_4_6_54aa5024_for_reg149)((uint)aVar42 & 0xffffffe0 | uVar124);
  uVar129 = ((src_params->shp_params).color_ctrl_p2_roll_tab[1] & 0x1fU) << 5;
  (ctx->reg).sharp.reg149 =
       (anon_struct_4_6_54aa5024_for_reg149)((uint)aVar42 & 0xfffffc00 | uVar124 | uVar129);
  uVar145 = ((src_params->shp_params).color_ctrl_p2_roll_tab[2] & 0x1fU) << 10;
  (ctx->reg).sharp.reg149 =
       (anon_struct_4_6_54aa5024_for_reg149)
       ((uint)aVar42 & 0xffff8000 | uVar124 | uVar129 | uVar145);
  uVar144 = ((src_params->shp_params).color_ctrl_p2_roll_tab[3] & 0x1fU) << 0xf;
  (ctx->reg).sharp.reg149 =
       (anon_struct_4_6_54aa5024_for_reg149)
       ((uint)aVar42 & 0xfff00000 | uVar124 | uVar129 | uVar145 | uVar144);
  uVar130 = ((src_params->shp_params).color_ctrl_p2_roll_tab[4] & 0x1fU) << 0x14;
  (ctx->reg).sharp.reg149 =
       (anon_struct_4_6_54aa5024_for_reg149)
       ((uint)aVar42 & 0xfe000000 | uVar124 | uVar129 | uVar145 | uVar144 | uVar130);
  (ctx->reg).sharp.reg149 =
       (anon_struct_4_6_54aa5024_for_reg149)
       ((uint)aVar42 & 0xc0000000 | uVar124 | uVar129 | uVar145 | uVar144 | uVar130 |
       ((src_params->shp_params).color_ctrl_p2_roll_tab[5] & 0x1fU) << 0x19);
  uVar124 = (src_params->shp_params).color_ctrl_p2_roll_tab[6] & 0x1f;
  aVar43 = (ctx->reg).sharp.reg150;
  (ctx->reg).sharp.reg150 =
       (anon_struct_4_6_e1af73c4_for_reg150)((uint)aVar43 & 0xffffffe0 | uVar124);
  uVar129 = ((src_params->shp_params).color_ctrl_p2_roll_tab[7] & 0x1fU) << 5;
  (ctx->reg).sharp.reg150 =
       (anon_struct_4_6_e1af73c4_for_reg150)((uint)aVar43 & 0xfffffc00 | uVar124 | uVar129);
  uVar145 = ((src_params->shp_params).color_ctrl_p2_roll_tab[8] & 0x1fU) << 10;
  (ctx->reg).sharp.reg150 =
       (anon_struct_4_6_e1af73c4_for_reg150)
       ((uint)aVar43 & 0xffff8000 | uVar124 | uVar129 | uVar145);
  uVar144 = ((src_params->shp_params).color_ctrl_p2_roll_tab[9] & 0x1fU) << 0xf;
  (ctx->reg).sharp.reg150 =
       (anon_struct_4_6_e1af73c4_for_reg150)
       ((uint)aVar43 & 0xfff00000 | uVar124 | uVar129 | uVar145 | uVar144);
  uVar130 = ((src_params->shp_params).color_ctrl_p2_roll_tab[10] & 0x1fU) << 0x14;
  (ctx->reg).sharp.reg150 =
       (anon_struct_4_6_e1af73c4_for_reg150)
       ((uint)aVar43 & 0xfe000000 | uVar124 | uVar129 | uVar145 | uVar144 | uVar130);
  (ctx->reg).sharp.reg150 =
       (anon_struct_4_6_e1af73c4_for_reg150)
       ((uint)aVar43 & 0xc0000000 | uVar124 | uVar129 | uVar145 | uVar144 | uVar130 |
       ((src_params->shp_params).color_ctrl_p2_roll_tab[0xb] & 0x1fU) << 0x19);
  uVar124 = (src_params->shp_params).color_ctrl_p2_roll_tab[0xc] & 0x1f;
  aVar44 = (ctx->reg).sharp.reg151;
  (ctx->reg).sharp.reg151 =
       (anon_struct_4_4_66464c83_for_reg151)((uint)aVar44 & 0xffffffe0 | uVar124);
  uVar129 = ((src_params->shp_params).color_ctrl_p2_roll_tab[0xd] & 0x1fU) << 5;
  (ctx->reg).sharp.reg151 =
       (anon_struct_4_4_66464c83_for_reg151)((uint)aVar44 & 0xfffffc00 | uVar124 | uVar129);
  uVar145 = ((src_params->shp_params).color_ctrl_p2_roll_tab[0xe] & 0x1fU) << 10;
  (ctx->reg).sharp.reg151 =
       (anon_struct_4_4_66464c83_for_reg151)
       ((uint)aVar44 & 0xffff8000 | uVar124 | uVar129 | uVar145);
  (ctx->reg).sharp.reg151 =
       (anon_struct_4_4_66464c83_for_reg151)
       ((uint)aVar44 & 0xfff00000 | uVar124 | uVar129 | uVar145 |
       ((src_params->shp_params).color_ctrl_p2_roll_tab[0xf] & 0x1fU) << 0xf);
  aVar59._1_3_ = SUB43((ctx->reg).sharp.reg152,1);
  aVar59._0_1_ = (char)(src_params->shp_params).color_ctrl_p3_point_u;
  (ctx->reg).sharp.reg152 = aVar59;
  uVar124 = ((src_params->shp_params).color_ctrl_p3_point_v & 0xffU) << 0xc;
  (ctx->reg).sharp.reg152 =
       (anon_struct_4_5_7839ecf9_for_reg152)((uint)aVar59 & 0xfff00fff | uVar124);
  (ctx->reg).sharp.reg152 =
       (anon_struct_4_5_7839ecf9_for_reg152)
       ((uint)aVar59 & 0xf8f00fff | uVar124 |
       ((src_params->shp_params).color_ctrl_p3_scaling_coef & 7U) << 0x18);
  uVar124 = (src_params->shp_params).color_ctrl_p3_roll_tab[0] & 0x1f;
  aVar45 = (ctx->reg).sharp.reg153;
  (ctx->reg).sharp.reg153 =
       (anon_struct_4_6_f3352084_for_reg153)((uint)aVar45 & 0xffffffe0 | uVar124);
  uVar129 = ((src_params->shp_params).color_ctrl_p3_roll_tab[1] & 0x1fU) << 5;
  (ctx->reg).sharp.reg153 =
       (anon_struct_4_6_f3352084_for_reg153)((uint)aVar45 & 0xfffffc00 | uVar124 | uVar129);
  uVar145 = ((src_params->shp_params).color_ctrl_p3_roll_tab[2] & 0x1fU) << 10;
  (ctx->reg).sharp.reg153 =
       (anon_struct_4_6_f3352084_for_reg153)
       ((uint)aVar45 & 0xffff8000 | uVar124 | uVar129 | uVar145);
  uVar144 = ((src_params->shp_params).color_ctrl_p3_roll_tab[3] & 0x1fU) << 0xf;
  (ctx->reg).sharp.reg153 =
       (anon_struct_4_6_f3352084_for_reg153)
       ((uint)aVar45 & 0xfff00000 | uVar124 | uVar129 | uVar145 | uVar144);
  uVar130 = ((src_params->shp_params).color_ctrl_p3_roll_tab[4] & 0x1fU) << 0x14;
  (ctx->reg).sharp.reg153 =
       (anon_struct_4_6_f3352084_for_reg153)
       ((uint)aVar45 & 0xfe000000 | uVar124 | uVar129 | uVar145 | uVar144 | uVar130);
  (ctx->reg).sharp.reg153 =
       (anon_struct_4_6_f3352084_for_reg153)
       ((uint)aVar45 & 0xc0000000 | uVar124 | uVar129 | uVar145 | uVar144 | uVar130 |
       ((src_params->shp_params).color_ctrl_p3_roll_tab[5] & 0x1fU) << 0x19);
  uVar124 = (src_params->shp_params).color_ctrl_p3_roll_tab[6] & 0x1f;
  aVar46 = (ctx->reg).sharp.reg154;
  (ctx->reg).sharp.reg154 =
       (anon_struct_4_6_df9877e4_for_reg154)((uint)aVar46 & 0xffffffe0 | uVar124);
  uVar129 = ((src_params->shp_params).color_ctrl_p3_roll_tab[7] & 0x1fU) << 5;
  (ctx->reg).sharp.reg154 =
       (anon_struct_4_6_df9877e4_for_reg154)((uint)aVar46 & 0xfffffc00 | uVar124 | uVar129);
  uVar145 = ((src_params->shp_params).color_ctrl_p3_roll_tab[8] & 0x1fU) << 10;
  (ctx->reg).sharp.reg154 =
       (anon_struct_4_6_df9877e4_for_reg154)
       ((uint)aVar46 & 0xffff8000 | uVar124 | uVar129 | uVar145);
  uVar144 = ((src_params->shp_params).color_ctrl_p3_roll_tab[9] & 0x1fU) << 0xf;
  (ctx->reg).sharp.reg154 =
       (anon_struct_4_6_df9877e4_for_reg154)
       ((uint)aVar46 & 0xfff00000 | uVar124 | uVar129 | uVar145 | uVar144);
  uVar130 = ((src_params->shp_params).color_ctrl_p3_roll_tab[10] & 0x1fU) << 0x14;
  (ctx->reg).sharp.reg154 =
       (anon_struct_4_6_df9877e4_for_reg154)
       ((uint)aVar46 & 0xfe000000 | uVar124 | uVar129 | uVar145 | uVar144 | uVar130);
  (ctx->reg).sharp.reg154 =
       (anon_struct_4_6_df9877e4_for_reg154)
       ((uint)aVar46 & 0xc0000000 | uVar124 | uVar129 | uVar145 | uVar144 | uVar130 |
       ((src_params->shp_params).color_ctrl_p3_roll_tab[0xb] & 0x1fU) << 0x19);
  uVar124 = (src_params->shp_params).color_ctrl_p3_roll_tab[0xc] & 0x1f;
  aVar47 = (ctx->reg).sharp.reg155;
  (ctx->reg).sharp.reg155 =
       (anon_struct_4_4_9cefec43_for_reg155)((uint)aVar47 & 0xffffffe0 | uVar124);
  uVar129 = ((src_params->shp_params).color_ctrl_p3_roll_tab[0xd] & 0x1fU) << 5;
  (ctx->reg).sharp.reg155 =
       (anon_struct_4_4_9cefec43_for_reg155)((uint)aVar47 & 0xfffffc00 | uVar124 | uVar129);
  uVar145 = ((src_params->shp_params).color_ctrl_p3_roll_tab[0xe] & 0x1fU) << 10;
  (ctx->reg).sharp.reg155 =
       (anon_struct_4_4_9cefec43_for_reg155)
       ((uint)aVar47 & 0xffff8000 | uVar124 | uVar129 | uVar145);
  (ctx->reg).sharp.reg155 =
       (anon_struct_4_4_9cefec43_for_reg155)
       ((uint)aVar47 & 0xfff00000 | uVar124 | uVar129 | uVar145 |
       ((src_params->shp_params).color_ctrl_p3_roll_tab[0xf] & 0x1fU) << 0xf);
  aVar48 = (ctx->reg).sharp.reg156;
  uVar140 = 1;
  uVar124 = (src_params->shp_params).tex_adj_mode_select & 1;
  (ctx->reg).sharp.reg156 =
       (anon_struct_4_6_adc393a5_for_reg156)((uint)aVar48 & 0xfffffffe | uVar124);
  aVar48 = (anon_struct_4_6_adc393a5_for_reg156)
           (((uint)aVar48 & 0xfffffff8 | uVar124) +
           ((src_params->shp_params).tex_adj_y_mode_select & 3U) * 2);
  (ctx->reg).sharp.reg156 = aVar48;
  uVar124 = (src_params->shp_params).tex_adj_grd[1];
  aVar48 = (anon_struct_4_6_adc393a5_for_reg156)
           (((uint)aVar48 & 0xfffff00f) + (uVar124 & 0x3fc) * 4);
  (ctx->reg).sharp.reg156 = aVar48;
  uVar129 = (src_params->shp_params).tex_adj_grd[2];
  (ctx->reg).sharp.reg156 =
       (anon_struct_4_6_adc393a5_for_reg156)((uint)aVar48 & 0xff00ffff | (uVar129 & 0x3fc) << 0xe);
  aVar49 = (ctx->reg).sharp.reg157;
  uVar144 = (uint)(src_params->shp_params).tex_adj_grd[3] >> 2 & 0xff;
  (ctx->reg).sharp.reg157 =
       (anon_struct_4_5_5dea9ddc_for_reg157)((uint)aVar49 & 0xffffff00 | uVar144);
  uVar145 = (src_params->shp_params).tex_adj_grd[4];
  uVar130 = (uVar145 & 0x3fc) << 10;
  (ctx->reg).sharp.reg157 =
       (anon_struct_4_5_5dea9ddc_for_reg157)((uint)aVar49 & 0xfff00f00 | uVar144 | uVar130);
  uVar135 = (src_params->shp_params).tex_adj_val[0] & 0x7f;
  (ctx->reg).sharp.reg157 =
       (anon_struct_4_5_5dea9ddc_for_reg157)
       ((uint)aVar49 & 0x80f00f00 | uVar144 | uVar130 | uVar135 << 0x18);
  aVar50 = (ctx->reg).sharp.reg158;
  uVar151 = (src_params->shp_params).tex_adj_val[1] & 0x7f;
  (ctx->reg).sharp.reg158 =
       (anon_struct_4_7_e0b31a4c_for_reg158)((uint)aVar50 & 0xffffff80 | uVar151);
  uVar131 = (src_params->shp_params).tex_adj_val[2] & 0x7f;
  uVar130 = uVar131 << 8;
  (ctx->reg).sharp.reg158 =
       (anon_struct_4_7_e0b31a4c_for_reg158)((uint)aVar50 & 0xffff8080 | uVar151 | uVar130);
  uVar161 = (src_params->shp_params).tex_adj_val[3] & 0x7f;
  (ctx->reg).sharp.reg158 =
       (anon_struct_4_7_e0b31a4c_for_reg158)
       ((uint)aVar50 & 0xff808080 | uVar151 | uVar130 | uVar161 << 0x10);
  uVar158 = (src_params->shp_params).tex_adj_val[4] & 0x7f;
  uVar160 = uVar124 >> 2 & 0xff;
  iVar147 = uVar160 + (uVar160 == 0);
  uVar129 = uVar129 >> 2 & 0xff;
  uVar124 = uVar144 - uVar129;
  uVar129 = uVar129 - uVar160;
  if ((int)uVar129 < 2) {
    uVar129 = uVar140;
  }
  (ctx->reg).sharp.reg158 =
       (anon_struct_4_7_e0b31a4c_for_reg158)
       ((uint)aVar50 & 0x80808080 | uVar151 | uVar130 | uVar161 << 0x10 | uVar158 << 0x18);
  if ((int)uVar124 < 2) {
    uVar124 = uVar140;
  }
  uVar145 = uVar145 >> 2 & 0xff;
  uVar144 = uVar145 - uVar144;
  if ((int)uVar144 < 2) {
    uVar144 = uVar140;
  }
  uVar145 = uVar145 ^ 0xff;
  fVar168 = ((float)(int)((src_params->shp_params).tex_adj_val[5] - uVar158) * 128.0) /
            (float)(uVar145 + (uVar145 == 0));
  if (fVar168 <= 0.0) {
    fVar166 = -0.5;
  }
  iVar126 = (int)(fVar166 + fVar168);
  fVar173 = (float)(int)(uVar151 - uVar135) * 128.0;
  fVar172 = (float)(int)(uVar161 - uVar131) * 128.0;
  auVar164._4_4_ = uVar124;
  auVar164._0_4_ = iVar147;
  auVar164._8_8_ = 0;
  auVar162._0_4_ = (float)iVar147;
  auVar162._4_4_ = (float)(int)uVar124;
  auVar162._8_8_ = 0;
  auVar184 = rcpps(auVar164,auVar162);
  fVar166 = fVar173 * auVar184._0_4_;
  fVar168 = fVar172 * auVar184._4_4_;
  fVar166 = (fVar173 - auVar162._0_4_ * fVar166) * auVar184._0_4_ + fVar166;
  fVar168 = (fVar172 - auVar162._4_4_ * fVar168) * auVar184._4_4_ + fVar168;
  uVar124 = -(uint)(0.0 < fVar166);
  uVar145 = -(uint)(0.0 < fVar168);
  auVar113._4_8_ = 0;
  auVar113._0_4_ = uVar124 & 0x3fe00000;
  auVar167._0_12_ = auVar113 << 0x20;
  auVar167._12_4_ = uVar145 & 0x3fe00000;
  auVar114._4_8_ = 0;
  auVar114._0_4_ = ~uVar124 & 0xbfe00000;
  auVar163._0_12_ = auVar114 << 0x20;
  auVar163._12_4_ = ~uVar145 & 0xbfe00000;
  fVar175 = (float)(int)(uVar131 - uVar151) * 128.0;
  fVar190 = (float)(int)(uVar158 - uVar161) * 128.0;
  auVar165._0_4_ = (float)(int)uVar129;
  auVar165._4_4_ = (float)(int)uVar144;
  auVar165._8_8_ = 0;
  auVar184 = rcpps(ZEXT416(uVar144),auVar165);
  fVar173 = fVar175 * auVar184._0_4_;
  fVar172 = fVar190 * auVar184._4_4_;
  fVar173 = (fVar175 - auVar165._0_4_ * fVar173) * auVar184._0_4_ + fVar173;
  fVar172 = (fVar190 - auVar165._4_4_ * fVar172) * auVar184._4_4_ + fVar172;
  uVar124 = -(uint)(0.0 < fVar173);
  uVar129 = -(uint)(0.0 < fVar172);
  auVar115._4_8_ = 0;
  auVar115._0_4_ = uVar124 & 0x3fe00000;
  auVar171._0_12_ = auVar115 << 0x20;
  auVar171._12_4_ = uVar129 & 0x3fe00000;
  auVar116._4_8_ = 0;
  auVar116._0_4_ = ~uVar124 & 0xbfe00000;
  auVar188._0_12_ = auVar116 << 0x20;
  auVar188._12_4_ = ~uVar129 & 0xbfe00000;
  uVar130 = (uint)(SUB168(auVar188 | auVar171,0) + (double)fVar173);
  uVar140 = (uint)(SUB168(auVar188 | auVar171,8) + (double)fVar172);
  uVar124 = (uint)(SUB168(auVar163 | auVar167,0) + (double)fVar166);
  uVar129 = (uint)(SUB168(auVar163 | auVar167,8) + (double)fVar168);
  uVar145 = -(uint)((int)uVar124 < 0x3ff);
  uVar144 = -(uint)((int)uVar129 < 0x3ff);
  uVar131 = ~uVar145 & 0x3ff | uVar124 & uVar145;
  uVar135 = ~uVar144 & 0x3ff | uVar129 & uVar144;
  uVar124 = -(uint)(-0x400 < (int)uVar131);
  uVar145 = -(uint)(-0x400 < (int)uVar135);
  aVar102 = (ctx->reg).sharp.reg160;
  uVar129 = -(uint)((int)uVar130 < 0x3ff);
  uVar144 = -(uint)((int)uVar140 < 0x3ff);
  uVar129 = ~uVar129 & 0x3ff | uVar130 & uVar129;
  uVar144 = ~uVar144 & 0x3ff | uVar140 & uVar144;
  uVar130 = -(uint)(-0x400 < (int)uVar129);
  uVar140 = -(uint)(-0x400 < (int)uVar144);
  (ctx->reg).sharp.reg159 =
       (anon_struct_4_3_fedd7f09_for_reg159)
       (((~uVar130 & 0xfffffc00 | uVar129 & uVar130) & 0x7ff) << 0xc |
       (uint)(ctx->reg).sharp.reg159 & 0xff800800 |
       (~uVar124 & 0xfffffc00 | uVar131 & uVar124) & 0x7ff);
  (ctx->reg).sharp.reg160 =
       (anon_struct_4_3_fedd8709_for_reg160)
       (((~uVar140 & 0xfffffc00 | uVar144 & uVar140) & 0x7ff) << 0xc |
       (uint)aVar102 & 0xff800800 | (~uVar145 & 0xfffffc00 | uVar135 & uVar145) & 0x7ff);
  iVar147 = 0x3ff;
  if (iVar126 < 0x3ff) {
    iVar147 = iVar126;
  }
  if (-0x400 < iVar147) {
    iVar148 = iVar147;
  }
  *(ushort *)&(ctx->reg).sharp.reg161 =
       *(ushort *)&(ctx->reg).sharp.reg161 & 0xf800 | (ushort)iVar148 & 0x7ff;
  RVar120 = src_params->dst_width;
  RVar121 = src_params->dst_height;
  RVar4 = src_params->src_height;
  (src_params->zme_params).src_width = src_params->src_width;
  (src_params->zme_params).src_height = RVar4;
  (src_params->zme_params).dst_width = RVar120;
  (src_params->zme_params).dst_height = RVar121;
  (src_params->zme_params).dst_fmt = src_params->dst_fmt;
  RVar4 = src_params->dst_c_width;
  (src_params->zme_params).yuv_out_diff = src_params->yuv_out_diff;
  (src_params->zme_params).dst_c_width = RVar4;
  (src_params->zme_params).dst_c_height = src_params->dst_c_height;
  set_zme_to_vdpp_reg(&src_params->zme_params,&ctx->zme);
  return extraout_EAX;
}

Assistant:

static MPP_RET vdpp2_params_to_reg(struct vdpp2_params* src_params, struct vdpp2_api_ctx *ctx)
{
    struct vdpp2_reg *dst_reg = &ctx->reg;
    struct zme_params *zme_params = &src_params->zme_params;

    memset(dst_reg, 0, sizeof(*dst_reg));

    dst_reg->common.reg0.sw_vdpp_frm_en = 1;

    /* 0x0004(reg1), TODO: add debug function */
    dst_reg->common.reg1.sw_vdpp_src_fmt = VDPP_FMT_YUV420;
    dst_reg->common.reg1.sw_vdpp_src_yuv_swap = src_params->src_yuv_swap;

    if (MPP_FMT_YUV420SP_VU == src_params->src_fmt)
        dst_reg->common.reg1.sw_vdpp_src_yuv_swap = 1;

    dst_reg->common.reg1.sw_vdpp_dst_fmt = src_params->dst_fmt;
    dst_reg->common.reg1.sw_vdpp_dst_yuv_swap = src_params->dst_yuv_swap;
    dst_reg->common.reg1.sw_vdpp_dbmsr_en = (src_params->working_mode == VDPP_WORK_MODE_DCI)
                                            ? 0
                                            : src_params->dmsr_params.dmsr_enable;

    /* 0x0008(reg2) */
    dst_reg->common.reg2.sw_vdpp_working_mode = src_params->working_mode;
    VDPP2_DBG(VDPP2_DBG_TRACE, "working_mode %d", src_params->working_mode);

    /* 0x000C ~ 0x001C(reg3 ~ reg7), skip */
    dst_reg->common.reg4.sw_vdpp_clk_on = 1;
    dst_reg->common.reg4.sw_md_clk_on = 1;
    dst_reg->common.reg4.sw_dect_clk_on = 1;
    dst_reg->common.reg4.sw_me_clk_on = 1;
    dst_reg->common.reg4.sw_mc_clk_on = 1;
    dst_reg->common.reg4.sw_eedi_clk_on = 1;
    dst_reg->common.reg4.sw_ble_clk_on = 1;
    dst_reg->common.reg4.sw_out_clk_on = 1;
    dst_reg->common.reg4.sw_ctrl_clk_on = 1;
    dst_reg->common.reg4.sw_ram_clk_on = 1;
    dst_reg->common.reg4.sw_dma_clk_on = 1;
    dst_reg->common.reg4.sw_reg_clk_on = 1;

    /* 0x0020(reg8) */
    dst_reg->common.reg8.sw_vdpp_frm_done_en = 1;
    dst_reg->common.reg8.sw_vdpp_osd_max_en = 1;
    dst_reg->common.reg8.sw_vdpp_bus_error_en = 1;
    dst_reg->common.reg8.sw_vdpp_timeout_int_en = 1;
    dst_reg->common.reg8.sw_vdpp_config_error_en = 1;
    /* 0x0024 ~ 0x002C(reg9 ~ reg11), skip */
    {
        RK_U32 src_right_redundant = src_params->src_width % 16 == 0 ? 0 : 16 - src_params->src_width % 16;
        RK_U32 src_down_redundant  = src_params->src_height % 8 == 0 ? 0 : 8 - src_params->src_height % 8;
        RK_U32 dst_right_redundant = src_params->dst_width % 16 == 0 ? 0 : 16 - src_params->dst_width % 16;
        /* 0x0030(reg12) */
        dst_reg->common.reg12.sw_vdpp_src_vir_y_stride = src_params->src_width_vir / 4;

        /* 0x0034(reg13) */
        dst_reg->common.reg13.sw_vdpp_dst_vir_y_stride = src_params->dst_width_vir / 4;

        /* 0x0038(reg14) */
        dst_reg->common.reg14.sw_vdpp_src_pic_width = src_params->src_width + src_right_redundant - 1;
        dst_reg->common.reg14.sw_vdpp_src_right_redundant = src_right_redundant;
        dst_reg->common.reg14.sw_vdpp_src_pic_height = src_params->src_height + src_down_redundant - 1;
        dst_reg->common.reg14.sw_vdpp_src_down_redundant = src_down_redundant;

        /* 0x003C(reg15) */
        dst_reg->common.reg15.sw_vdpp_dst_pic_width = src_params->dst_width + dst_right_redundant - 1;
        dst_reg->common.reg15.sw_vdpp_dst_right_redundant = dst_right_redundant;
        dst_reg->common.reg15.sw_vdpp_dst_pic_height = src_params->dst_height - 1;
    }
    /* 0x0040 ~ 0x005C(reg16 ~ reg23), skip */
    dst_reg->common.reg20.sw_vdpp_timeout_en = 1;
    dst_reg->common.reg20.sw_vdpp_timeout_cnt = 0x8FFFFFF;

    /* 0x0060(reg24) */
    dst_reg->common.reg24.sw_vdpp_src_addr_y = src_params->src.y;

    /* 0x0064(reg25) */
    dst_reg->common.reg25.sw_vdpp_src_addr_uv = src_params->src.cbcr;

    /* 0x0068(reg26) */
    dst_reg->common.reg26.sw_vdpp_dst_addr_y = src_params->dst.y;

    /* 0x006C(reg27) */
    dst_reg->common.reg27.sw_vdpp_dst_addr_uv = src_params->dst.cbcr;

    if (src_params->yuv_out_diff) {
        RK_U32 dst_right_redundant_c = src_params->dst_c_width % 16 == 0 ? 0 : 16 - src_params->dst_c_width % 16;

        dst_reg->common.reg1.sw_vdpp_yuvout_diff_en = src_params->yuv_out_diff;
        dst_reg->common.reg13.sw_vdpp_dst_vir_c_stride = src_params->dst_c_width_vir / 4;
        /* 0x0040(reg16) */
        dst_reg->common.reg16.sw_vdpp_dst_pic_width_c = src_params->dst_c_width + dst_right_redundant_c - 1;
        dst_reg->common.reg16.sw_vdpp_dst_right_redundant_c = dst_right_redundant_c;
        dst_reg->common.reg16.sw_vdpp_dst_pic_height_c = src_params->dst_c_height - 1;

        dst_reg->common.reg27.sw_vdpp_dst_addr_uv = src_params->dst_c.cbcr;
    }

    set_dmsr_to_vdpp_reg(&src_params->dmsr_params, &ctx->dmsr);
    set_hist_to_vdpp2_reg(src_params, dst_reg);
    set_es_to_vdpp2_reg(src_params, dst_reg);
    set_shp_to_vdpp2_reg(src_params, dst_reg);

    zme_params->src_width = src_params->src_width;
    zme_params->src_height = src_params->src_height;
    zme_params->dst_width = src_params->dst_width;
    zme_params->dst_height = src_params->dst_height;
    zme_params->dst_fmt = src_params->dst_fmt;
    zme_params->yuv_out_diff = src_params->yuv_out_diff;
    zme_params->dst_c_width = src_params->dst_c_width;
    zme_params->dst_c_height = src_params->dst_c_height;
    set_zme_to_vdpp_reg(zme_params, &ctx->zme);

    return MPP_OK;
}